

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFragmentOutputTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::FragmentOutputTests::init(FragmentOutputTests *this,EVP_PKEY_CTX *ctx)

{
  DataType DVar1;
  Precision PVar2;
  Context *pCVar3;
  undefined8 uVar4;
  deUint32 dVar5;
  int extraout_EAX;
  TestNode *pTVar6;
  TestNode *pTVar7;
  char *pcVar8;
  FragmentOutputCase *pFVar9;
  long *plVar10;
  TestNode *pTVar11;
  pointer pBVar12;
  pointer pFVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  float fVar18;
  vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
  outputs;
  vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
  targets;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string precName;
  vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
  fboSpec;
  string fmtName;
  vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
  local_2b8;
  undefined1 local_298 [24];
  long lStack_280;
  undefined1 local_278 [24];
  long lStack_260;
  DataType **local_258;
  iterator iStack_250;
  DataType *local_248 [2];
  FragmentOutput local_238;
  vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
  local_228;
  TestNode *local_210;
  BufferSpec local_208;
  long local_1f8 [2];
  vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
  local_1e8;
  TestNode *local_1d0;
  FragmentOutputCase *local_1c8;
  long local_1c0;
  TestNode *local_1b8;
  BufferSpec local_1b0;
  long local_1a0 [12];
  ios_base local_140 [264];
  long local_38;
  
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"basic",
             "Basic fragment output tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"float",
             "Floating-point output tests");
  local_1b8 = pTVar6;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  lVar14 = 0;
  local_210 = pTVar7;
  local_1d0 = (TestNode *)this;
  do {
    DVar1 = init::requiredFloatFormats[lVar14];
    local_1c8 = (FragmentOutputCase *)lVar14;
    pcVar8 = FboTestUtil::getFormatName(DVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,pcVar8,(allocator<char> *)&local_208);
    local_1e8.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_finish = (BufferSpec *)0x0;
    local_1e8.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (BufferSpec *)0x0;
    local_208.width = 0x40;
    local_208.height = 0x40;
    local_208.samples = 0;
    local_208.format = DVar1;
    std::
    vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ::_M_realloc_insert<deqp::gles3::Functional::BufferSpec>(&local_1e8,(iterator)0x0,&local_208);
    lVar14 = 0;
    do {
      PVar2 = *(Precision *)((long)init::precisions + lVar14);
      local_1c0 = lVar14;
      pcVar8 = glu::getPrecisionName(PVar2);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,pcVar8,(allocator<char> *)local_298);
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar3 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
      local_258 = local_248;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,CONCAT44(local_1b0.width,local_1b0.format),
                 CONCAT44(local_1b0.samples,local_1b0.height) +
                 CONCAT44(local_1b0.width,local_1b0.format));
      std::__cxx11::string::append((char *)&local_258);
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_258,CONCAT44(local_208.width,local_208.format));
      local_278._0_8_ = local_278 + 0x10;
      pBVar12 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pBVar12) {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        lStack_260 = plVar10[3];
      }
      else {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        local_278._0_8_ = (pointer)*plVar10;
      }
      local_278._8_8_ = plVar10[1];
      *plVar10 = (long)pBVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(local_278);
      local_298._0_8_ = local_298 + 0x10;
      pFVar13 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pFVar13) {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        lStack_280 = plVar10[3];
      }
      else {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        local_298._0_8_ = (pointer)*plVar10;
      }
      uVar4 = local_298._0_8_;
      local_298._8_8_ = plVar10[1];
      *plVar10 = (long)pFVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_238.type = TYPE_FLOAT;
      local_238.location = 0;
      local_238.arrayLength = 0;
      local_238.precision = PVar2;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
      ::_M_realloc_insert<deqp::gles3::Functional::FragmentOutput_const&>
                ((vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
                  *)&local_2b8,(iterator)0x0,&local_238);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector(&local_228,&local_2b8);
      FragmentOutputCase::FragmentOutputCase(pFVar9,pCVar3,(char *)uVar4,"",&local_1e8,&local_228);
      tcu::TestNode::addChild(local_210,(TestNode *)pFVar9);
      if (local_228.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      pTVar6 = local_1d0;
      if (local_2b8.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2b8.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_298._0_8_ != (pointer)(local_298 + 0x10)) {
        operator_delete((void *)local_298._0_8_,(ulong)((long)(DataType *)local_298._16_8_ + 1));
      }
      if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
        operator_delete((void *)local_278._0_8_,(ulong)((long)(deUint32 *)local_278._16_8_ + 1));
      }
      if (local_258 != local_248) {
        operator_delete(local_258,(ulong)((long)local_248[0] + 1));
      }
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar3 = (Context *)pTVar6[1]._vptr_TestNode;
      local_258 = local_248;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,CONCAT44(local_1b0.width,local_1b0.format),
                 CONCAT44(local_1b0.samples,local_1b0.height) +
                 CONCAT44(local_1b0.width,local_1b0.format));
      std::__cxx11::string::append((char *)&local_258);
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_258,CONCAT44(local_208.width,local_208.format));
      local_278._0_8_ = local_278 + 0x10;
      pBVar12 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pBVar12) {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        lStack_260 = plVar10[3];
      }
      else {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        local_278._0_8_ = (pointer)*plVar10;
      }
      local_278._8_8_ = plVar10[1];
      *plVar10 = (long)pBVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(local_278);
      local_298._0_8_ = local_298 + 0x10;
      pFVar13 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pFVar13) {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        lStack_280 = plVar10[3];
      }
      else {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        local_298._0_8_ = (pointer)*plVar10;
      }
      uVar4 = local_298._0_8_;
      local_298._8_8_ = plVar10[1];
      *plVar10 = (long)pFVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_238.type = TYPE_FLOAT_VEC2;
      local_238.location = 0;
      local_238.arrayLength = 0;
      local_238.precision = PVar2;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
      ::_M_realloc_insert<deqp::gles3::Functional::FragmentOutput_const&>
                ((vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
                  *)&local_2b8,(iterator)0x0,&local_238);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector(&local_228,&local_2b8);
      FragmentOutputCase::FragmentOutputCase(pFVar9,pCVar3,(char *)uVar4,"",&local_1e8,&local_228);
      tcu::TestNode::addChild(local_210,(TestNode *)pFVar9);
      if (local_228.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      pTVar6 = local_1d0;
      if (local_2b8.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2b8.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_298._0_8_ != (pointer)(local_298 + 0x10)) {
        operator_delete((void *)local_298._0_8_,(ulong)((long)(DataType *)local_298._16_8_ + 1));
      }
      if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
        operator_delete((void *)local_278._0_8_,(ulong)((long)(deUint32 *)local_278._16_8_ + 1));
      }
      if (local_258 != local_248) {
        operator_delete(local_258,(ulong)((long)local_248[0] + 1));
      }
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar3 = (Context *)pTVar6[1]._vptr_TestNode;
      local_258 = local_248;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,CONCAT44(local_1b0.width,local_1b0.format),
                 CONCAT44(local_1b0.samples,local_1b0.height) +
                 CONCAT44(local_1b0.width,local_1b0.format));
      std::__cxx11::string::append((char *)&local_258);
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_258,CONCAT44(local_208.width,local_208.format));
      local_278._0_8_ = local_278 + 0x10;
      pBVar12 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pBVar12) {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        lStack_260 = plVar10[3];
      }
      else {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        local_278._0_8_ = (pointer)*plVar10;
      }
      local_278._8_8_ = plVar10[1];
      *plVar10 = (long)pBVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(local_278);
      local_298._0_8_ = local_298 + 0x10;
      pFVar13 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pFVar13) {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        lStack_280 = plVar10[3];
      }
      else {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        local_298._0_8_ = (pointer)*plVar10;
      }
      uVar4 = local_298._0_8_;
      local_298._8_8_ = plVar10[1];
      *plVar10 = (long)pFVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_238.type = TYPE_FLOAT_VEC3;
      local_238.location = 0;
      local_238.arrayLength = 0;
      local_238.precision = PVar2;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
      ::_M_realloc_insert<deqp::gles3::Functional::FragmentOutput_const&>
                ((vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
                  *)&local_2b8,(iterator)0x0,&local_238);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector(&local_228,&local_2b8);
      FragmentOutputCase::FragmentOutputCase(pFVar9,pCVar3,(char *)uVar4,"",&local_1e8,&local_228);
      tcu::TestNode::addChild(local_210,(TestNode *)pFVar9);
      if (local_228.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      pTVar6 = local_1d0;
      if (local_2b8.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2b8.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_298._0_8_ != (pointer)(local_298 + 0x10)) {
        operator_delete((void *)local_298._0_8_,(ulong)((long)(DataType *)local_298._16_8_ + 1));
      }
      if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
        operator_delete((void *)local_278._0_8_,(ulong)((long)(deUint32 *)local_278._16_8_ + 1));
      }
      if (local_258 != local_248) {
        operator_delete(local_258,(ulong)((long)local_248[0] + 1));
      }
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar3 = (Context *)pTVar6[1]._vptr_TestNode;
      local_258 = local_248;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,CONCAT44(local_1b0.width,local_1b0.format),
                 CONCAT44(local_1b0.samples,local_1b0.height) +
                 CONCAT44(local_1b0.width,local_1b0.format));
      std::__cxx11::string::append((char *)&local_258);
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_258,CONCAT44(local_208.width,local_208.format));
      local_278._0_8_ = local_278 + 0x10;
      pBVar12 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pBVar12) {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        lStack_260 = plVar10[3];
      }
      else {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        local_278._0_8_ = (pointer)*plVar10;
      }
      local_278._8_8_ = plVar10[1];
      *plVar10 = (long)pBVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(local_278);
      local_298._0_8_ = local_298 + 0x10;
      pFVar13 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pFVar13) {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        lStack_280 = plVar10[3];
      }
      else {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        local_298._0_8_ = (pointer)*plVar10;
      }
      uVar4 = local_298._0_8_;
      local_298._8_8_ = plVar10[1];
      *plVar10 = (long)pFVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_238.type = TYPE_FLOAT_VEC4;
      local_238.location = 0;
      local_238.arrayLength = 0;
      local_238.precision = PVar2;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
      ::_M_realloc_insert<deqp::gles3::Functional::FragmentOutput_const&>
                ((vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
                  *)&local_2b8,(iterator)0x0,&local_238);
      pTVar6 = local_210;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector(&local_228,&local_2b8);
      FragmentOutputCase::FragmentOutputCase(pFVar9,pCVar3,(char *)uVar4,"",&local_1e8,&local_228);
      tcu::TestNode::addChild(pTVar6,(TestNode *)pFVar9);
      this = (FragmentOutputTests *)local_1d0;
      if (local_228.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_2b8.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2b8.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_298._0_8_ != (pointer)(local_298 + 0x10)) {
        operator_delete((void *)local_298._0_8_,(ulong)((long)(DataType *)local_298._16_8_ + 1));
      }
      if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
        operator_delete((void *)local_278._0_8_,(ulong)((long)(deUint32 *)local_278._16_8_ + 1));
      }
      if (local_258 != local_248) {
        operator_delete(local_258,(ulong)((long)local_248[0] + 1));
      }
      if ((long *)CONCAT44(local_208.width,local_208.format) != local_1f8) {
        operator_delete((long *)CONCAT44(local_208.width,local_208.format),local_1f8[0] + 1);
      }
      lVar14 = local_1c0 + 4;
    } while (lVar14 != 0xc);
    if (local_1e8.
        super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1e8.
                      super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1e8.
                            super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1e8.
                            super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((long *)CONCAT44(local_1b0.width,local_1b0.format) != local_1a0) {
      operator_delete((long *)CONCAT44(local_1b0.width,local_1b0.format),local_1a0[0] + 1);
    }
    lVar14 = (long)local_1c8 + 1;
  } while (lVar14 != 7);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,((TestNode *)this)->m_testCtx,"fixed",
             "Fixed-point output tests");
  tcu::TestNode::addChild(local_1b8,pTVar6);
  lVar14 = 0;
  local_210 = pTVar6;
  do {
    DVar1 = init::requiredFixedFormats[lVar14];
    local_1c8 = (FragmentOutputCase *)lVar14;
    pcVar8 = FboTestUtil::getFormatName(DVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,pcVar8,(allocator<char> *)&local_208);
    local_1e8.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_finish = (BufferSpec *)0x0;
    local_1e8.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (BufferSpec *)0x0;
    local_208.width = 0x40;
    local_208.height = 0x40;
    local_208.samples = 0;
    local_208.format = DVar1;
    std::
    vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ::_M_realloc_insert<deqp::gles3::Functional::BufferSpec>(&local_1e8,(iterator)0x0,&local_208);
    lVar14 = 0;
    do {
      PVar2 = *(Precision *)((long)init::precisions + lVar14);
      local_1c0 = lVar14;
      pcVar8 = glu::getPrecisionName(PVar2);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,pcVar8,(allocator<char> *)local_298);
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar3 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
      local_258 = local_248;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,CONCAT44(local_1b0.width,local_1b0.format),
                 CONCAT44(local_1b0.samples,local_1b0.height) +
                 CONCAT44(local_1b0.width,local_1b0.format));
      std::__cxx11::string::append((char *)&local_258);
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_258,CONCAT44(local_208.width,local_208.format));
      local_278._0_8_ = local_278 + 0x10;
      pBVar12 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pBVar12) {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        lStack_260 = plVar10[3];
      }
      else {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        local_278._0_8_ = (pointer)*plVar10;
      }
      local_278._8_8_ = plVar10[1];
      *plVar10 = (long)pBVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(local_278);
      local_298._0_8_ = local_298 + 0x10;
      pFVar13 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pFVar13) {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        lStack_280 = plVar10[3];
      }
      else {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        local_298._0_8_ = (pointer)*plVar10;
      }
      uVar4 = local_298._0_8_;
      local_298._8_8_ = plVar10[1];
      *plVar10 = (long)pFVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_238.type = TYPE_FLOAT;
      local_238.location = 0;
      local_238.arrayLength = 0;
      local_238.precision = PVar2;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
      ::_M_realloc_insert<deqp::gles3::Functional::FragmentOutput_const&>
                ((vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
                  *)&local_2b8,(iterator)0x0,&local_238);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector(&local_228,&local_2b8);
      FragmentOutputCase::FragmentOutputCase(pFVar9,pCVar3,(char *)uVar4,"",&local_1e8,&local_228);
      tcu::TestNode::addChild(local_210,(TestNode *)pFVar9);
      if (local_228.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      pTVar6 = local_1d0;
      if (local_2b8.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2b8.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_298._0_8_ != (pointer)(local_298 + 0x10)) {
        operator_delete((void *)local_298._0_8_,(ulong)((long)(DataType *)local_298._16_8_ + 1));
      }
      if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
        operator_delete((void *)local_278._0_8_,(ulong)((long)(deUint32 *)local_278._16_8_ + 1));
      }
      if (local_258 != local_248) {
        operator_delete(local_258,(ulong)((long)local_248[0] + 1));
      }
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar3 = (Context *)pTVar6[1]._vptr_TestNode;
      local_258 = local_248;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,CONCAT44(local_1b0.width,local_1b0.format),
                 CONCAT44(local_1b0.samples,local_1b0.height) +
                 CONCAT44(local_1b0.width,local_1b0.format));
      std::__cxx11::string::append((char *)&local_258);
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_258,CONCAT44(local_208.width,local_208.format));
      local_278._0_8_ = local_278 + 0x10;
      pBVar12 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pBVar12) {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        lStack_260 = plVar10[3];
      }
      else {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        local_278._0_8_ = (pointer)*plVar10;
      }
      local_278._8_8_ = plVar10[1];
      *plVar10 = (long)pBVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(local_278);
      local_298._0_8_ = local_298 + 0x10;
      pFVar13 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pFVar13) {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        lStack_280 = plVar10[3];
      }
      else {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        local_298._0_8_ = (pointer)*plVar10;
      }
      uVar4 = local_298._0_8_;
      local_298._8_8_ = plVar10[1];
      *plVar10 = (long)pFVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_238.type = TYPE_FLOAT_VEC2;
      local_238.location = 0;
      local_238.arrayLength = 0;
      local_238.precision = PVar2;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
      ::_M_realloc_insert<deqp::gles3::Functional::FragmentOutput_const&>
                ((vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
                  *)&local_2b8,(iterator)0x0,&local_238);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector(&local_228,&local_2b8);
      FragmentOutputCase::FragmentOutputCase(pFVar9,pCVar3,(char *)uVar4,"",&local_1e8,&local_228);
      tcu::TestNode::addChild(local_210,(TestNode *)pFVar9);
      if (local_228.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      pTVar6 = local_1d0;
      if (local_2b8.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2b8.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_298._0_8_ != (pointer)(local_298 + 0x10)) {
        operator_delete((void *)local_298._0_8_,(ulong)((long)(DataType *)local_298._16_8_ + 1));
      }
      if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
        operator_delete((void *)local_278._0_8_,(ulong)((long)(deUint32 *)local_278._16_8_ + 1));
      }
      if (local_258 != local_248) {
        operator_delete(local_258,(ulong)((long)local_248[0] + 1));
      }
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar3 = (Context *)pTVar6[1]._vptr_TestNode;
      local_258 = local_248;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,CONCAT44(local_1b0.width,local_1b0.format),
                 CONCAT44(local_1b0.samples,local_1b0.height) +
                 CONCAT44(local_1b0.width,local_1b0.format));
      std::__cxx11::string::append((char *)&local_258);
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_258,CONCAT44(local_208.width,local_208.format));
      local_278._0_8_ = local_278 + 0x10;
      pBVar12 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pBVar12) {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        lStack_260 = plVar10[3];
      }
      else {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        local_278._0_8_ = (pointer)*plVar10;
      }
      local_278._8_8_ = plVar10[1];
      *plVar10 = (long)pBVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(local_278);
      local_298._0_8_ = local_298 + 0x10;
      pFVar13 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pFVar13) {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        lStack_280 = plVar10[3];
      }
      else {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        local_298._0_8_ = (pointer)*plVar10;
      }
      uVar4 = local_298._0_8_;
      local_298._8_8_ = plVar10[1];
      *plVar10 = (long)pFVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_238.type = TYPE_FLOAT_VEC3;
      local_238.location = 0;
      local_238.arrayLength = 0;
      local_238.precision = PVar2;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
      ::_M_realloc_insert<deqp::gles3::Functional::FragmentOutput_const&>
                ((vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
                  *)&local_2b8,(iterator)0x0,&local_238);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector(&local_228,&local_2b8);
      FragmentOutputCase::FragmentOutputCase(pFVar9,pCVar3,(char *)uVar4,"",&local_1e8,&local_228);
      tcu::TestNode::addChild(local_210,(TestNode *)pFVar9);
      if (local_228.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      pTVar6 = local_1d0;
      if (local_2b8.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2b8.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_298._0_8_ != (pointer)(local_298 + 0x10)) {
        operator_delete((void *)local_298._0_8_,(ulong)((long)(DataType *)local_298._16_8_ + 1));
      }
      if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
        operator_delete((void *)local_278._0_8_,(ulong)((long)(deUint32 *)local_278._16_8_ + 1));
      }
      if (local_258 != local_248) {
        operator_delete(local_258,(ulong)((long)local_248[0] + 1));
      }
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar3 = (Context *)pTVar6[1]._vptr_TestNode;
      local_258 = local_248;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,CONCAT44(local_1b0.width,local_1b0.format),
                 CONCAT44(local_1b0.samples,local_1b0.height) +
                 CONCAT44(local_1b0.width,local_1b0.format));
      std::__cxx11::string::append((char *)&local_258);
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_258,CONCAT44(local_208.width,local_208.format));
      local_278._0_8_ = local_278 + 0x10;
      pBVar12 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pBVar12) {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        lStack_260 = plVar10[3];
      }
      else {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        local_278._0_8_ = (pointer)*plVar10;
      }
      local_278._8_8_ = plVar10[1];
      *plVar10 = (long)pBVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(local_278);
      local_298._0_8_ = local_298 + 0x10;
      pFVar13 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pFVar13) {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        lStack_280 = plVar10[3];
      }
      else {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        local_298._0_8_ = (pointer)*plVar10;
      }
      uVar4 = local_298._0_8_;
      local_298._8_8_ = plVar10[1];
      *plVar10 = (long)pFVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_238.type = TYPE_FLOAT_VEC4;
      local_238.location = 0;
      local_238.arrayLength = 0;
      local_238.precision = PVar2;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
      ::_M_realloc_insert<deqp::gles3::Functional::FragmentOutput_const&>
                ((vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
                  *)&local_2b8,(iterator)0x0,&local_238);
      pTVar6 = local_210;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector(&local_228,&local_2b8);
      FragmentOutputCase::FragmentOutputCase(pFVar9,pCVar3,(char *)uVar4,"",&local_1e8,&local_228);
      tcu::TestNode::addChild(pTVar6,(TestNode *)pFVar9);
      this = (FragmentOutputTests *)local_1d0;
      if (local_228.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_2b8.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2b8.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_298._0_8_ != (pointer)(local_298 + 0x10)) {
        operator_delete((void *)local_298._0_8_,(ulong)((long)(DataType *)local_298._16_8_ + 1));
      }
      if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
        operator_delete((void *)local_278._0_8_,(ulong)((long)(deUint32 *)local_278._16_8_ + 1));
      }
      if (local_258 != local_248) {
        operator_delete(local_258,(ulong)((long)local_248[0] + 1));
      }
      if ((long *)CONCAT44(local_208.width,local_208.format) != local_1f8) {
        operator_delete((long *)CONCAT44(local_208.width,local_208.format),local_1f8[0] + 1);
      }
      lVar14 = local_1c0 + 4;
    } while (lVar14 != 0xc);
    if (local_1e8.
        super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1e8.
                      super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1e8.
                            super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1e8.
                            super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((long *)CONCAT44(local_1b0.width,local_1b0.format) != local_1a0) {
      operator_delete((long *)CONCAT44(local_1b0.width,local_1b0.format),local_1a0[0] + 1);
    }
    lVar14 = (long)local_1c8 + 1;
  } while (lVar14 != 9);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,((TestNode *)this)->m_testCtx,"int","Integer output tests");
  tcu::TestNode::addChild(local_1b8,pTVar6);
  lVar14 = 0;
  local_210 = pTVar6;
  do {
    DVar1 = init::requiredIntFormats[lVar14];
    local_1c8 = (FragmentOutputCase *)lVar14;
    pcVar8 = FboTestUtil::getFormatName(DVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,pcVar8,(allocator<char> *)&local_208);
    local_1e8.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_finish = (BufferSpec *)0x0;
    local_1e8.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (BufferSpec *)0x0;
    local_208.width = 0x40;
    local_208.height = 0x40;
    local_208.samples = 0;
    local_208.format = DVar1;
    std::
    vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ::_M_realloc_insert<deqp::gles3::Functional::BufferSpec>(&local_1e8,(iterator)0x0,&local_208);
    lVar14 = 0;
    do {
      PVar2 = *(Precision *)((long)init::precisions + lVar14);
      local_1c0 = lVar14;
      pcVar8 = glu::getPrecisionName(PVar2);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,pcVar8,(allocator<char> *)local_298);
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar3 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
      local_258 = local_248;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,CONCAT44(local_1b0.width,local_1b0.format),
                 CONCAT44(local_1b0.samples,local_1b0.height) +
                 CONCAT44(local_1b0.width,local_1b0.format));
      std::__cxx11::string::append((char *)&local_258);
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_258,CONCAT44(local_208.width,local_208.format));
      local_278._0_8_ = local_278 + 0x10;
      pBVar12 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pBVar12) {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        lStack_260 = plVar10[3];
      }
      else {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        local_278._0_8_ = (pointer)*plVar10;
      }
      local_278._8_8_ = plVar10[1];
      *plVar10 = (long)pBVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(local_278);
      local_298._0_8_ = local_298 + 0x10;
      pFVar13 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pFVar13) {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        lStack_280 = plVar10[3];
      }
      else {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        local_298._0_8_ = (pointer)*plVar10;
      }
      uVar4 = local_298._0_8_;
      local_298._8_8_ = plVar10[1];
      *plVar10 = (long)pFVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_238.type = TYPE_INT;
      local_238.location = 0;
      local_238.arrayLength = 0;
      local_238.precision = PVar2;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
      ::_M_realloc_insert<deqp::gles3::Functional::FragmentOutput_const&>
                ((vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
                  *)&local_2b8,(iterator)0x0,&local_238);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector(&local_228,&local_2b8);
      FragmentOutputCase::FragmentOutputCase(pFVar9,pCVar3,(char *)uVar4,"",&local_1e8,&local_228);
      tcu::TestNode::addChild(local_210,(TestNode *)pFVar9);
      if (local_228.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      pTVar6 = local_1d0;
      if (local_2b8.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2b8.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_298._0_8_ != (pointer)(local_298 + 0x10)) {
        operator_delete((void *)local_298._0_8_,(ulong)((long)(DataType *)local_298._16_8_ + 1));
      }
      if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
        operator_delete((void *)local_278._0_8_,(ulong)((long)(deUint32 *)local_278._16_8_ + 1));
      }
      if (local_258 != local_248) {
        operator_delete(local_258,(ulong)((long)local_248[0] + 1));
      }
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar3 = (Context *)pTVar6[1]._vptr_TestNode;
      local_258 = local_248;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,CONCAT44(local_1b0.width,local_1b0.format),
                 CONCAT44(local_1b0.samples,local_1b0.height) +
                 CONCAT44(local_1b0.width,local_1b0.format));
      std::__cxx11::string::append((char *)&local_258);
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_258,CONCAT44(local_208.width,local_208.format));
      local_278._0_8_ = local_278 + 0x10;
      pBVar12 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pBVar12) {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        lStack_260 = plVar10[3];
      }
      else {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        local_278._0_8_ = (pointer)*plVar10;
      }
      local_278._8_8_ = plVar10[1];
      *plVar10 = (long)pBVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(local_278);
      local_298._0_8_ = local_298 + 0x10;
      pFVar13 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pFVar13) {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        lStack_280 = plVar10[3];
      }
      else {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        local_298._0_8_ = (pointer)*plVar10;
      }
      uVar4 = local_298._0_8_;
      local_298._8_8_ = plVar10[1];
      *plVar10 = (long)pFVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_238.type = TYPE_INT_VEC2;
      local_238.location = 0;
      local_238.arrayLength = 0;
      local_238.precision = PVar2;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
      ::_M_realloc_insert<deqp::gles3::Functional::FragmentOutput_const&>
                ((vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
                  *)&local_2b8,(iterator)0x0,&local_238);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector(&local_228,&local_2b8);
      FragmentOutputCase::FragmentOutputCase(pFVar9,pCVar3,(char *)uVar4,"",&local_1e8,&local_228);
      tcu::TestNode::addChild(local_210,(TestNode *)pFVar9);
      if (local_228.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      pTVar6 = local_1d0;
      if (local_2b8.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2b8.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_298._0_8_ != (pointer)(local_298 + 0x10)) {
        operator_delete((void *)local_298._0_8_,(ulong)((long)(DataType *)local_298._16_8_ + 1));
      }
      if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
        operator_delete((void *)local_278._0_8_,(ulong)((long)(deUint32 *)local_278._16_8_ + 1));
      }
      if (local_258 != local_248) {
        operator_delete(local_258,(ulong)((long)local_248[0] + 1));
      }
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar3 = (Context *)pTVar6[1]._vptr_TestNode;
      local_258 = local_248;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,CONCAT44(local_1b0.width,local_1b0.format),
                 CONCAT44(local_1b0.samples,local_1b0.height) +
                 CONCAT44(local_1b0.width,local_1b0.format));
      std::__cxx11::string::append((char *)&local_258);
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_258,CONCAT44(local_208.width,local_208.format));
      local_278._0_8_ = local_278 + 0x10;
      pBVar12 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pBVar12) {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        lStack_260 = plVar10[3];
      }
      else {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        local_278._0_8_ = (pointer)*plVar10;
      }
      local_278._8_8_ = plVar10[1];
      *plVar10 = (long)pBVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(local_278);
      local_298._0_8_ = local_298 + 0x10;
      pFVar13 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pFVar13) {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        lStack_280 = plVar10[3];
      }
      else {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        local_298._0_8_ = (pointer)*plVar10;
      }
      uVar4 = local_298._0_8_;
      local_298._8_8_ = plVar10[1];
      *plVar10 = (long)pFVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_238.type = TYPE_INT_VEC3;
      local_238.location = 0;
      local_238.arrayLength = 0;
      local_238.precision = PVar2;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
      ::_M_realloc_insert<deqp::gles3::Functional::FragmentOutput_const&>
                ((vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
                  *)&local_2b8,(iterator)0x0,&local_238);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector(&local_228,&local_2b8);
      FragmentOutputCase::FragmentOutputCase(pFVar9,pCVar3,(char *)uVar4,"",&local_1e8,&local_228);
      tcu::TestNode::addChild(local_210,(TestNode *)pFVar9);
      if (local_228.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      pTVar6 = local_1d0;
      if (local_2b8.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2b8.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_298._0_8_ != (pointer)(local_298 + 0x10)) {
        operator_delete((void *)local_298._0_8_,(ulong)((long)(DataType *)local_298._16_8_ + 1));
      }
      if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
        operator_delete((void *)local_278._0_8_,(ulong)((long)(deUint32 *)local_278._16_8_ + 1));
      }
      if (local_258 != local_248) {
        operator_delete(local_258,(ulong)((long)local_248[0] + 1));
      }
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar3 = (Context *)pTVar6[1]._vptr_TestNode;
      local_258 = local_248;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,CONCAT44(local_1b0.width,local_1b0.format),
                 CONCAT44(local_1b0.samples,local_1b0.height) +
                 CONCAT44(local_1b0.width,local_1b0.format));
      std::__cxx11::string::append((char *)&local_258);
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_258,CONCAT44(local_208.width,local_208.format));
      local_278._0_8_ = local_278 + 0x10;
      pBVar12 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pBVar12) {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        lStack_260 = plVar10[3];
      }
      else {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        local_278._0_8_ = (pointer)*plVar10;
      }
      local_278._8_8_ = plVar10[1];
      *plVar10 = (long)pBVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(local_278);
      local_298._0_8_ = local_298 + 0x10;
      pFVar13 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pFVar13) {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        lStack_280 = plVar10[3];
      }
      else {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        local_298._0_8_ = (pointer)*plVar10;
      }
      uVar4 = local_298._0_8_;
      local_298._8_8_ = plVar10[1];
      *plVar10 = (long)pFVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_238.type = TYPE_INT_VEC4;
      local_238.location = 0;
      local_238.arrayLength = 0;
      local_238.precision = PVar2;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
      ::_M_realloc_insert<deqp::gles3::Functional::FragmentOutput_const&>
                ((vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
                  *)&local_2b8,(iterator)0x0,&local_238);
      pTVar6 = local_210;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector(&local_228,&local_2b8);
      FragmentOutputCase::FragmentOutputCase(pFVar9,pCVar3,(char *)uVar4,"",&local_1e8,&local_228);
      tcu::TestNode::addChild(pTVar6,(TestNode *)pFVar9);
      this = (FragmentOutputTests *)local_1d0;
      if (local_228.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_2b8.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2b8.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_298._0_8_ != (pointer)(local_298 + 0x10)) {
        operator_delete((void *)local_298._0_8_,(ulong)((long)(DataType *)local_298._16_8_ + 1));
      }
      if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
        operator_delete((void *)local_278._0_8_,(ulong)((long)(deUint32 *)local_278._16_8_ + 1));
      }
      if (local_258 != local_248) {
        operator_delete(local_258,(ulong)((long)local_248[0] + 1));
      }
      if ((long *)CONCAT44(local_208.width,local_208.format) != local_1f8) {
        operator_delete((long *)CONCAT44(local_208.width,local_208.format),local_1f8[0] + 1);
      }
      lVar14 = local_1c0 + 4;
    } while (lVar14 != 0xc);
    if (local_1e8.
        super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1e8.
                      super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1e8.
                            super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1e8.
                            super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((long *)CONCAT44(local_1b0.width,local_1b0.format) != local_1a0) {
      operator_delete((long *)CONCAT44(local_1b0.width,local_1b0.format),local_1a0[0] + 1);
    }
    lVar14 = (long)local_1c8 + 1;
  } while (lVar14 != 9);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,((TestNode *)this)->m_testCtx,"uint",
             "Usigned integer output tests");
  local_210 = pTVar6;
  tcu::TestNode::addChild(local_1b8,pTVar6);
  lVar14 = 0;
  do {
    DVar1 = init::requiredUintFormats[lVar14];
    local_1c8 = (FragmentOutputCase *)lVar14;
    pcVar8 = FboTestUtil::getFormatName(DVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,pcVar8,(allocator<char> *)&local_208);
    local_1e8.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_finish = (BufferSpec *)0x0;
    local_1e8.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (BufferSpec *)0x0;
    local_208.width = 0x40;
    local_208.height = 0x40;
    local_208.samples = 0;
    local_208.format = DVar1;
    std::
    vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ::_M_realloc_insert<deqp::gles3::Functional::BufferSpec>(&local_1e8,(iterator)0x0,&local_208);
    lVar14 = 0;
    do {
      PVar2 = *(Precision *)((long)init::precisions + lVar14);
      local_1c0 = lVar14;
      pcVar8 = glu::getPrecisionName(PVar2);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,pcVar8,(allocator<char> *)local_298);
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar3 = (Context *)local_1d0[1]._vptr_TestNode;
      local_258 = local_248;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,CONCAT44(local_1b0.width,local_1b0.format),
                 CONCAT44(local_1b0.samples,local_1b0.height) +
                 CONCAT44(local_1b0.width,local_1b0.format));
      std::__cxx11::string::append((char *)&local_258);
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_258,CONCAT44(local_208.width,local_208.format));
      local_278._0_8_ = local_278 + 0x10;
      pBVar12 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pBVar12) {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        lStack_260 = plVar10[3];
      }
      else {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        local_278._0_8_ = (pointer)*plVar10;
      }
      local_278._8_8_ = plVar10[1];
      *plVar10 = (long)pBVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(local_278);
      local_298._0_8_ = local_298 + 0x10;
      pFVar13 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pFVar13) {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        lStack_280 = plVar10[3];
      }
      else {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        local_298._0_8_ = (pointer)*plVar10;
      }
      uVar4 = local_298._0_8_;
      local_298._8_8_ = plVar10[1];
      *plVar10 = (long)pFVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_238.type = TYPE_UINT;
      local_238.location = 0;
      local_238.arrayLength = 0;
      local_238.precision = PVar2;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
      ::_M_realloc_insert<deqp::gles3::Functional::FragmentOutput_const&>
                ((vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
                  *)&local_2b8,(iterator)0x0,&local_238);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector(&local_228,&local_2b8);
      FragmentOutputCase::FragmentOutputCase(pFVar9,pCVar3,(char *)uVar4,"",&local_1e8,&local_228);
      tcu::TestNode::addChild(local_210,(TestNode *)pFVar9);
      if (local_228.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_2b8.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2b8.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_298._0_8_ != (pointer)(local_298 + 0x10)) {
        operator_delete((void *)local_298._0_8_,(ulong)((long)(DataType *)local_298._16_8_ + 1));
      }
      if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
        operator_delete((void *)local_278._0_8_,(ulong)((long)(deUint32 *)local_278._16_8_ + 1));
      }
      if (local_258 != local_248) {
        operator_delete(local_258,(ulong)((long)local_248[0] + 1));
      }
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar3 = (Context *)local_1d0[1]._vptr_TestNode;
      local_258 = local_248;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,CONCAT44(local_1b0.width,local_1b0.format),
                 CONCAT44(local_1b0.samples,local_1b0.height) +
                 CONCAT44(local_1b0.width,local_1b0.format));
      std::__cxx11::string::append((char *)&local_258);
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_258,CONCAT44(local_208.width,local_208.format));
      local_278._0_8_ = local_278 + 0x10;
      pBVar12 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pBVar12) {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        lStack_260 = plVar10[3];
      }
      else {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        local_278._0_8_ = (pointer)*plVar10;
      }
      local_278._8_8_ = plVar10[1];
      *plVar10 = (long)pBVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(local_278);
      local_298._0_8_ = local_298 + 0x10;
      pFVar13 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pFVar13) {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        lStack_280 = plVar10[3];
      }
      else {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        local_298._0_8_ = (pointer)*plVar10;
      }
      uVar4 = local_298._0_8_;
      local_298._8_8_ = plVar10[1];
      *plVar10 = (long)pFVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_238.type = TYPE_UINT_VEC2;
      local_238.location = 0;
      local_238.arrayLength = 0;
      local_238.precision = PVar2;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
      ::_M_realloc_insert<deqp::gles3::Functional::FragmentOutput_const&>
                ((vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
                  *)&local_2b8,(iterator)0x0,&local_238);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector(&local_228,&local_2b8);
      FragmentOutputCase::FragmentOutputCase(pFVar9,pCVar3,(char *)uVar4,"",&local_1e8,&local_228);
      tcu::TestNode::addChild(local_210,(TestNode *)pFVar9);
      if (local_228.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_2b8.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2b8.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_298._0_8_ != (pointer)(local_298 + 0x10)) {
        operator_delete((void *)local_298._0_8_,(ulong)((long)(DataType *)local_298._16_8_ + 1));
      }
      if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
        operator_delete((void *)local_278._0_8_,(ulong)((long)(deUint32 *)local_278._16_8_ + 1));
      }
      if (local_258 != local_248) {
        operator_delete(local_258,(ulong)((long)local_248[0] + 1));
      }
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar3 = (Context *)local_1d0[1]._vptr_TestNode;
      local_258 = local_248;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,CONCAT44(local_1b0.width,local_1b0.format),
                 CONCAT44(local_1b0.samples,local_1b0.height) +
                 CONCAT44(local_1b0.width,local_1b0.format));
      std::__cxx11::string::append((char *)&local_258);
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_258,CONCAT44(local_208.width,local_208.format));
      local_278._0_8_ = local_278 + 0x10;
      pBVar12 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pBVar12) {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        lStack_260 = plVar10[3];
      }
      else {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        local_278._0_8_ = (pointer)*plVar10;
      }
      local_278._8_8_ = plVar10[1];
      *plVar10 = (long)pBVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(local_278);
      local_298._0_8_ = local_298 + 0x10;
      pFVar13 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pFVar13) {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        lStack_280 = plVar10[3];
      }
      else {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        local_298._0_8_ = (pointer)*plVar10;
      }
      uVar4 = local_298._0_8_;
      local_298._8_8_ = plVar10[1];
      *plVar10 = (long)pFVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_238.type = TYPE_UINT_VEC3;
      local_238.location = 0;
      local_238.arrayLength = 0;
      local_238.precision = PVar2;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
      ::_M_realloc_insert<deqp::gles3::Functional::FragmentOutput_const&>
                ((vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
                  *)&local_2b8,(iterator)0x0,&local_238);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector(&local_228,&local_2b8);
      FragmentOutputCase::FragmentOutputCase(pFVar9,pCVar3,(char *)uVar4,"",&local_1e8,&local_228);
      tcu::TestNode::addChild(local_210,(TestNode *)pFVar9);
      if (local_228.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_2b8.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2b8.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_298._0_8_ != (pointer)(local_298 + 0x10)) {
        operator_delete((void *)local_298._0_8_,(ulong)((long)(DataType *)local_298._16_8_ + 1));
      }
      if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
        operator_delete((void *)local_278._0_8_,(ulong)((long)(deUint32 *)local_278._16_8_ + 1));
      }
      if (local_258 != local_248) {
        operator_delete(local_258,(ulong)((long)local_248[0] + 1));
      }
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar3 = (Context *)local_1d0[1]._vptr_TestNode;
      local_258 = local_248;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,CONCAT44(local_1b0.width,local_1b0.format),
                 CONCAT44(local_1b0.samples,local_1b0.height) +
                 CONCAT44(local_1b0.width,local_1b0.format));
      std::__cxx11::string::append((char *)&local_258);
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_258,CONCAT44(local_208.width,local_208.format));
      local_278._0_8_ = local_278 + 0x10;
      pBVar12 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pBVar12) {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        lStack_260 = plVar10[3];
      }
      else {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        local_278._0_8_ = (pointer)*plVar10;
      }
      local_278._8_8_ = plVar10[1];
      *plVar10 = (long)pBVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(local_278);
      local_298._0_8_ = local_298 + 0x10;
      pFVar13 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pFVar13) {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        lStack_280 = plVar10[3];
      }
      else {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        local_298._0_8_ = (pointer)*plVar10;
      }
      uVar4 = local_298._0_8_;
      local_298._8_8_ = plVar10[1];
      *plVar10 = (long)pFVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_238.type = TYPE_UINT_VEC4;
      local_238.location = 0;
      local_238.arrayLength = 0;
      local_238.precision = PVar2;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
      ::_M_realloc_insert<deqp::gles3::Functional::FragmentOutput_const&>
                ((vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
                  *)&local_2b8,(iterator)0x0,&local_238);
      pTVar6 = local_1d0;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector(&local_228,&local_2b8);
      FragmentOutputCase::FragmentOutputCase(pFVar9,pCVar3,(char *)uVar4,"",&local_1e8,&local_228);
      tcu::TestNode::addChild(local_210,(TestNode *)pFVar9);
      if (local_228.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_2b8.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2b8.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_298._0_8_ != (pointer)(local_298 + 0x10)) {
        operator_delete((void *)local_298._0_8_,(ulong)((long)(DataType *)local_298._16_8_ + 1));
      }
      if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
        operator_delete((void *)local_278._0_8_,(ulong)((long)(deUint32 *)local_278._16_8_ + 1));
      }
      if (local_258 != local_248) {
        operator_delete(local_258,(ulong)((long)local_248[0] + 1));
      }
      if ((long *)CONCAT44(local_208.width,local_208.format) != local_1f8) {
        operator_delete((long *)CONCAT44(local_208.width,local_208.format),local_1f8[0] + 1);
      }
      lVar14 = local_1c0 + 4;
    } while (lVar14 != 0xc);
    if (local_1e8.
        super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1e8.
                      super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1e8.
                            super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1e8.
                            super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((long *)CONCAT44(local_1b0.width,local_1b0.format) != local_1a0) {
      operator_delete((long *)CONCAT44(local_1b0.width,local_1b0.format),local_1a0[0] + 1);
    }
    lVar14 = (long)local_1c8 + 1;
  } while (lVar14 != 10);
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,pTVar6->m_testCtx,"array","Array outputs");
  tcu::TestNode::addChild(pTVar6,pTVar7);
  pTVar11 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar11,pTVar6->m_testCtx,"float","Floating-point output tests");
  tcu::TestNode::addChild(pTVar7,pTVar11);
  lVar14 = 0;
  local_210 = pTVar11;
  local_1b8 = pTVar7;
  do {
    DVar1 = init::requiredFloatFormats[lVar14];
    local_1c8 = (FragmentOutputCase *)lVar14;
    pcVar8 = FboTestUtil::getFormatName(DVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,pcVar8,(allocator<char> *)&local_208);
    local_1e8.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_finish = (BufferSpec *)0x0;
    local_1e8.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (BufferSpec *)0x0;
    iVar16 = 3;
    do {
      local_208.width = 0x40;
      local_208.height = 0x40;
      local_208.samples = 0;
      local_208.format = DVar1;
      if (local_1e8.
          super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_1e8.
          super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
        ::_M_realloc_insert<deqp::gles3::Functional::BufferSpec>
                  (&local_1e8,
                   (iterator)
                   local_1e8.
                   super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_208);
      }
      else {
        (local_1e8.
         super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
         ._M_impl.super__Vector_impl_data._M_finish)->format = DVar1;
        (local_1e8.
         super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
         ._M_impl.super__Vector_impl_data._M_finish)->width = 0x40;
        (local_1e8.
         super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
         ._M_impl.super__Vector_impl_data._M_finish)->height = 0x40;
        (local_1e8.
         super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
         ._M_impl.super__Vector_impl_data._M_finish)->samples = 0;
        local_1e8.
        super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_1e8.
             super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      iVar16 = iVar16 + -1;
    } while (iVar16 != 0);
    lVar14 = 0;
    do {
      PVar2 = *(Precision *)((long)init::precisions + lVar14);
      local_1c0 = lVar14;
      pcVar8 = glu::getPrecisionName(PVar2);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,pcVar8,(allocator<char> *)local_298);
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar3 = (Context *)pTVar6[1]._vptr_TestNode;
      local_258 = local_248;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,CONCAT44(local_1b0.width,local_1b0.format),
                 CONCAT44(local_1b0.samples,local_1b0.height) +
                 CONCAT44(local_1b0.width,local_1b0.format));
      std::__cxx11::string::append((char *)&local_258);
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_258,CONCAT44(local_208.width,local_208.format));
      local_278._0_8_ = local_278 + 0x10;
      pBVar12 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pBVar12) {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        lStack_260 = plVar10[3];
      }
      else {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        local_278._0_8_ = (pointer)*plVar10;
      }
      local_278._8_8_ = plVar10[1];
      *plVar10 = (long)pBVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(local_278);
      local_298._0_8_ = local_298 + 0x10;
      pFVar13 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pFVar13) {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        lStack_280 = plVar10[3];
      }
      else {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        local_298._0_8_ = (pointer)*plVar10;
      }
      uVar4 = local_298._0_8_;
      local_298._8_8_ = plVar10[1];
      *plVar10 = (long)pFVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_238.type = TYPE_FLOAT;
      local_238.location = 0;
      local_238.arrayLength = 3;
      local_238.precision = PVar2;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
      ::_M_realloc_insert<deqp::gles3::Functional::FragmentOutput_const&>
                ((vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
                  *)&local_2b8,(iterator)0x0,&local_238);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector(&local_228,&local_2b8);
      FragmentOutputCase::FragmentOutputCase(pFVar9,pCVar3,(char *)uVar4,"",&local_1e8,&local_228);
      tcu::TestNode::addChild(local_210,(TestNode *)pFVar9);
      if (local_228.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      pTVar6 = local_1d0;
      if (local_2b8.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2b8.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_298._0_8_ != (pointer)(local_298 + 0x10)) {
        operator_delete((void *)local_298._0_8_,(ulong)((long)(DataType *)local_298._16_8_ + 1));
      }
      if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
        operator_delete((void *)local_278._0_8_,(ulong)((long)(deUint32 *)local_278._16_8_ + 1));
      }
      if (local_258 != local_248) {
        operator_delete(local_258,(ulong)((long)local_248[0] + 1));
      }
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar3 = (Context *)pTVar6[1]._vptr_TestNode;
      local_258 = local_248;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,CONCAT44(local_1b0.width,local_1b0.format),
                 CONCAT44(local_1b0.samples,local_1b0.height) +
                 CONCAT44(local_1b0.width,local_1b0.format));
      std::__cxx11::string::append((char *)&local_258);
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_258,CONCAT44(local_208.width,local_208.format));
      local_278._0_8_ = local_278 + 0x10;
      pBVar12 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pBVar12) {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        lStack_260 = plVar10[3];
      }
      else {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        local_278._0_8_ = (pointer)*plVar10;
      }
      local_278._8_8_ = plVar10[1];
      *plVar10 = (long)pBVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(local_278);
      local_298._0_8_ = local_298 + 0x10;
      pFVar13 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pFVar13) {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        lStack_280 = plVar10[3];
      }
      else {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        local_298._0_8_ = (pointer)*plVar10;
      }
      uVar4 = local_298._0_8_;
      local_298._8_8_ = plVar10[1];
      *plVar10 = (long)pFVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_238.type = TYPE_FLOAT_VEC2;
      local_238.location = 0;
      local_238.arrayLength = 3;
      local_238.precision = PVar2;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
      ::_M_realloc_insert<deqp::gles3::Functional::FragmentOutput_const&>
                ((vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
                  *)&local_2b8,(iterator)0x0,&local_238);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector(&local_228,&local_2b8);
      FragmentOutputCase::FragmentOutputCase(pFVar9,pCVar3,(char *)uVar4,"",&local_1e8,&local_228);
      tcu::TestNode::addChild(local_210,(TestNode *)pFVar9);
      if (local_228.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      pTVar6 = local_1d0;
      if (local_2b8.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2b8.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_298._0_8_ != (pointer)(local_298 + 0x10)) {
        operator_delete((void *)local_298._0_8_,(ulong)((long)(DataType *)local_298._16_8_ + 1));
      }
      if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
        operator_delete((void *)local_278._0_8_,(ulong)((long)(deUint32 *)local_278._16_8_ + 1));
      }
      if (local_258 != local_248) {
        operator_delete(local_258,(ulong)((long)local_248[0] + 1));
      }
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar3 = (Context *)pTVar6[1]._vptr_TestNode;
      local_258 = local_248;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,CONCAT44(local_1b0.width,local_1b0.format),
                 CONCAT44(local_1b0.samples,local_1b0.height) +
                 CONCAT44(local_1b0.width,local_1b0.format));
      std::__cxx11::string::append((char *)&local_258);
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_258,CONCAT44(local_208.width,local_208.format));
      local_278._0_8_ = local_278 + 0x10;
      pBVar12 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pBVar12) {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        lStack_260 = plVar10[3];
      }
      else {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        local_278._0_8_ = (pointer)*plVar10;
      }
      local_278._8_8_ = plVar10[1];
      *plVar10 = (long)pBVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(local_278);
      local_298._0_8_ = local_298 + 0x10;
      pFVar13 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pFVar13) {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        lStack_280 = plVar10[3];
      }
      else {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        local_298._0_8_ = (pointer)*plVar10;
      }
      uVar4 = local_298._0_8_;
      local_298._8_8_ = plVar10[1];
      *plVar10 = (long)pFVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_238.type = TYPE_FLOAT_VEC3;
      local_238.location = 0;
      local_238.arrayLength = 3;
      local_238.precision = PVar2;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
      ::_M_realloc_insert<deqp::gles3::Functional::FragmentOutput_const&>
                ((vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
                  *)&local_2b8,(iterator)0x0,&local_238);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector(&local_228,&local_2b8);
      FragmentOutputCase::FragmentOutputCase(pFVar9,pCVar3,(char *)uVar4,"",&local_1e8,&local_228);
      tcu::TestNode::addChild(local_210,(TestNode *)pFVar9);
      if (local_228.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      pTVar6 = local_1d0;
      if (local_2b8.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2b8.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_298._0_8_ != (pointer)(local_298 + 0x10)) {
        operator_delete((void *)local_298._0_8_,(ulong)((long)(DataType *)local_298._16_8_ + 1));
      }
      if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
        operator_delete((void *)local_278._0_8_,(ulong)((long)(deUint32 *)local_278._16_8_ + 1));
      }
      if (local_258 != local_248) {
        operator_delete(local_258,(ulong)((long)local_248[0] + 1));
      }
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar3 = (Context *)pTVar6[1]._vptr_TestNode;
      local_258 = local_248;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,CONCAT44(local_1b0.width,local_1b0.format),
                 CONCAT44(local_1b0.samples,local_1b0.height) +
                 CONCAT44(local_1b0.width,local_1b0.format));
      std::__cxx11::string::append((char *)&local_258);
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_258,CONCAT44(local_208.width,local_208.format));
      local_278._0_8_ = local_278 + 0x10;
      pBVar12 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pBVar12) {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        lStack_260 = plVar10[3];
      }
      else {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        local_278._0_8_ = (pointer)*plVar10;
      }
      local_278._8_8_ = plVar10[1];
      *plVar10 = (long)pBVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(local_278);
      local_298._0_8_ = local_298 + 0x10;
      pFVar13 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pFVar13) {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        lStack_280 = plVar10[3];
      }
      else {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        local_298._0_8_ = (pointer)*plVar10;
      }
      uVar4 = local_298._0_8_;
      local_298._8_8_ = plVar10[1];
      *plVar10 = (long)pFVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_238.type = TYPE_FLOAT_VEC4;
      local_238.location = 0;
      local_238.arrayLength = 3;
      local_238.precision = PVar2;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
      ::_M_realloc_insert<deqp::gles3::Functional::FragmentOutput_const&>
                ((vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
                  *)&local_2b8,(iterator)0x0,&local_238);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector(&local_228,&local_2b8);
      FragmentOutputCase::FragmentOutputCase(pFVar9,pCVar3,(char *)uVar4,"",&local_1e8,&local_228);
      tcu::TestNode::addChild(local_210,(TestNode *)pFVar9);
      if (local_228.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_2b8.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2b8.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_298._0_8_ != (pointer)(local_298 + 0x10)) {
        operator_delete((void *)local_298._0_8_,(ulong)((long)(DataType *)local_298._16_8_ + 1));
      }
      if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
        operator_delete((void *)local_278._0_8_,(ulong)((long)(deUint32 *)local_278._16_8_ + 1));
      }
      if (local_258 != local_248) {
        operator_delete(local_258,(ulong)((long)local_248[0] + 1));
      }
      if ((long *)CONCAT44(local_208.width,local_208.format) != local_1f8) {
        operator_delete((long *)CONCAT44(local_208.width,local_208.format),local_1f8[0] + 1);
      }
      pTVar7 = local_1b8;
      lVar14 = local_1c0 + 4;
    } while (lVar14 != 0xc);
    if (local_1e8.
        super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1e8.
                      super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1e8.
                            super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1e8.
                            super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((long *)CONCAT44(local_1b0.width,local_1b0.format) != local_1a0) {
      operator_delete((long *)CONCAT44(local_1b0.width,local_1b0.format),local_1a0[0] + 1);
    }
    lVar14 = (long)local_1c8 + 1;
  } while (lVar14 != 7);
  pTVar11 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar11,pTVar6->m_testCtx,"fixed","Fixed-point output tests");
  tcu::TestNode::addChild(pTVar7,pTVar11);
  pFVar9 = (FragmentOutputCase *)0x0;
  local_210 = pTVar11;
  do {
    DVar1 = init::requiredFixedFormats[(long)pFVar9];
    local_1c8 = pFVar9;
    pcVar8 = FboTestUtil::getFormatName(DVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,pcVar8,(allocator<char> *)&local_208);
    local_1e8.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_finish = (BufferSpec *)0x0;
    local_1e8.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (BufferSpec *)0x0;
    iVar16 = 3;
    do {
      local_208.width = 0x40;
      local_208.height = 0x40;
      local_208.samples = 0;
      local_208.format = DVar1;
      if (local_1e8.
          super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_1e8.
          super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
        ::_M_realloc_insert<deqp::gles3::Functional::BufferSpec>
                  (&local_1e8,
                   (iterator)
                   local_1e8.
                   super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_208);
      }
      else {
        (local_1e8.
         super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
         ._M_impl.super__Vector_impl_data._M_finish)->format = DVar1;
        (local_1e8.
         super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
         ._M_impl.super__Vector_impl_data._M_finish)->width = 0x40;
        (local_1e8.
         super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
         ._M_impl.super__Vector_impl_data._M_finish)->height = 0x40;
        (local_1e8.
         super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
         ._M_impl.super__Vector_impl_data._M_finish)->samples = 0;
        local_1e8.
        super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_1e8.
             super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      iVar16 = iVar16 + -1;
    } while (iVar16 != 0);
    lVar14 = 0;
    do {
      PVar2 = *(Precision *)((long)init::precisions + lVar14);
      local_1c0 = lVar14;
      pcVar8 = glu::getPrecisionName(PVar2);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,pcVar8,(allocator<char> *)local_298);
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar3 = (Context *)pTVar6[1]._vptr_TestNode;
      local_258 = local_248;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,CONCAT44(local_1b0.width,local_1b0.format),
                 CONCAT44(local_1b0.samples,local_1b0.height) +
                 CONCAT44(local_1b0.width,local_1b0.format));
      std::__cxx11::string::append((char *)&local_258);
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_258,CONCAT44(local_208.width,local_208.format));
      local_278._0_8_ = local_278 + 0x10;
      pBVar12 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pBVar12) {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        lStack_260 = plVar10[3];
      }
      else {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        local_278._0_8_ = (pointer)*plVar10;
      }
      local_278._8_8_ = plVar10[1];
      *plVar10 = (long)pBVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(local_278);
      local_298._0_8_ = local_298 + 0x10;
      pFVar13 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pFVar13) {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        lStack_280 = plVar10[3];
      }
      else {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        local_298._0_8_ = (pointer)*plVar10;
      }
      uVar4 = local_298._0_8_;
      local_298._8_8_ = plVar10[1];
      *plVar10 = (long)pFVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_238.type = TYPE_FLOAT;
      local_238.location = 0;
      local_238.arrayLength = 3;
      local_238.precision = PVar2;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
      ::_M_realloc_insert<deqp::gles3::Functional::FragmentOutput_const&>
                ((vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
                  *)&local_2b8,(iterator)0x0,&local_238);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector(&local_228,&local_2b8);
      FragmentOutputCase::FragmentOutputCase(pFVar9,pCVar3,(char *)uVar4,"",&local_1e8,&local_228);
      tcu::TestNode::addChild(local_210,(TestNode *)pFVar9);
      if (local_228.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      pTVar6 = local_1d0;
      if (local_2b8.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2b8.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_298._0_8_ != (pointer)(local_298 + 0x10)) {
        operator_delete((void *)local_298._0_8_,(ulong)((long)(DataType *)local_298._16_8_ + 1));
      }
      if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
        operator_delete((void *)local_278._0_8_,(ulong)((long)(deUint32 *)local_278._16_8_ + 1));
      }
      if (local_258 != local_248) {
        operator_delete(local_258,(ulong)((long)local_248[0] + 1));
      }
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar3 = (Context *)pTVar6[1]._vptr_TestNode;
      local_258 = local_248;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,CONCAT44(local_1b0.width,local_1b0.format),
                 CONCAT44(local_1b0.samples,local_1b0.height) +
                 CONCAT44(local_1b0.width,local_1b0.format));
      std::__cxx11::string::append((char *)&local_258);
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_258,CONCAT44(local_208.width,local_208.format));
      local_278._0_8_ = local_278 + 0x10;
      pBVar12 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pBVar12) {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        lStack_260 = plVar10[3];
      }
      else {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        local_278._0_8_ = (pointer)*plVar10;
      }
      local_278._8_8_ = plVar10[1];
      *plVar10 = (long)pBVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(local_278);
      local_298._0_8_ = local_298 + 0x10;
      pFVar13 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pFVar13) {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        lStack_280 = plVar10[3];
      }
      else {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        local_298._0_8_ = (pointer)*plVar10;
      }
      uVar4 = local_298._0_8_;
      local_298._8_8_ = plVar10[1];
      *plVar10 = (long)pFVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_238.type = TYPE_FLOAT_VEC2;
      local_238.location = 0;
      local_238.arrayLength = 3;
      local_238.precision = PVar2;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
      ::_M_realloc_insert<deqp::gles3::Functional::FragmentOutput_const&>
                ((vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
                  *)&local_2b8,(iterator)0x0,&local_238);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector(&local_228,&local_2b8);
      FragmentOutputCase::FragmentOutputCase(pFVar9,pCVar3,(char *)uVar4,"",&local_1e8,&local_228);
      tcu::TestNode::addChild(local_210,(TestNode *)pFVar9);
      if (local_228.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      pTVar6 = local_1d0;
      if (local_2b8.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2b8.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_298._0_8_ != (pointer)(local_298 + 0x10)) {
        operator_delete((void *)local_298._0_8_,(ulong)((long)(DataType *)local_298._16_8_ + 1));
      }
      if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
        operator_delete((void *)local_278._0_8_,(ulong)((long)(deUint32 *)local_278._16_8_ + 1));
      }
      if (local_258 != local_248) {
        operator_delete(local_258,(ulong)((long)local_248[0] + 1));
      }
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar3 = (Context *)pTVar6[1]._vptr_TestNode;
      local_258 = local_248;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,CONCAT44(local_1b0.width,local_1b0.format),
                 CONCAT44(local_1b0.samples,local_1b0.height) +
                 CONCAT44(local_1b0.width,local_1b0.format));
      std::__cxx11::string::append((char *)&local_258);
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_258,CONCAT44(local_208.width,local_208.format));
      local_278._0_8_ = local_278 + 0x10;
      pBVar12 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pBVar12) {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        lStack_260 = plVar10[3];
      }
      else {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        local_278._0_8_ = (pointer)*plVar10;
      }
      local_278._8_8_ = plVar10[1];
      *plVar10 = (long)pBVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(local_278);
      local_298._0_8_ = local_298 + 0x10;
      pFVar13 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pFVar13) {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        lStack_280 = plVar10[3];
      }
      else {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        local_298._0_8_ = (pointer)*plVar10;
      }
      uVar4 = local_298._0_8_;
      local_298._8_8_ = plVar10[1];
      *plVar10 = (long)pFVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_238.type = TYPE_FLOAT_VEC3;
      local_238.location = 0;
      local_238.arrayLength = 3;
      local_238.precision = PVar2;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
      ::_M_realloc_insert<deqp::gles3::Functional::FragmentOutput_const&>
                ((vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
                  *)&local_2b8,(iterator)0x0,&local_238);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector(&local_228,&local_2b8);
      FragmentOutputCase::FragmentOutputCase(pFVar9,pCVar3,(char *)uVar4,"",&local_1e8,&local_228);
      tcu::TestNode::addChild(local_210,(TestNode *)pFVar9);
      if (local_228.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      pTVar6 = local_1d0;
      if (local_2b8.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2b8.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_298._0_8_ != (pointer)(local_298 + 0x10)) {
        operator_delete((void *)local_298._0_8_,(ulong)((long)(DataType *)local_298._16_8_ + 1));
      }
      if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
        operator_delete((void *)local_278._0_8_,(ulong)((long)(deUint32 *)local_278._16_8_ + 1));
      }
      if (local_258 != local_248) {
        operator_delete(local_258,(ulong)((long)local_248[0] + 1));
      }
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar3 = (Context *)pTVar6[1]._vptr_TestNode;
      local_258 = local_248;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,CONCAT44(local_1b0.width,local_1b0.format),
                 CONCAT44(local_1b0.samples,local_1b0.height) +
                 CONCAT44(local_1b0.width,local_1b0.format));
      std::__cxx11::string::append((char *)&local_258);
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_258,CONCAT44(local_208.width,local_208.format));
      local_278._0_8_ = local_278 + 0x10;
      pBVar12 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pBVar12) {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        lStack_260 = plVar10[3];
      }
      else {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        local_278._0_8_ = (pointer)*plVar10;
      }
      local_278._8_8_ = plVar10[1];
      *plVar10 = (long)pBVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(local_278);
      local_298._0_8_ = local_298 + 0x10;
      pFVar13 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pFVar13) {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        lStack_280 = plVar10[3];
      }
      else {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        local_298._0_8_ = (pointer)*plVar10;
      }
      uVar4 = local_298._0_8_;
      local_298._8_8_ = plVar10[1];
      *plVar10 = (long)pFVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_238.type = TYPE_FLOAT_VEC4;
      local_238.location = 0;
      local_238.arrayLength = 3;
      local_238.precision = PVar2;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
      ::_M_realloc_insert<deqp::gles3::Functional::FragmentOutput_const&>
                ((vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
                  *)&local_2b8,(iterator)0x0,&local_238);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector(&local_228,&local_2b8);
      FragmentOutputCase::FragmentOutputCase(pFVar9,pCVar3,(char *)uVar4,"",&local_1e8,&local_228);
      tcu::TestNode::addChild(local_210,(TestNode *)pFVar9);
      if (local_228.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_2b8.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2b8.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_298._0_8_ != (pointer)(local_298 + 0x10)) {
        operator_delete((void *)local_298._0_8_,(ulong)((long)(DataType *)local_298._16_8_ + 1));
      }
      if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
        operator_delete((void *)local_278._0_8_,(ulong)((long)(deUint32 *)local_278._16_8_ + 1));
      }
      if (local_258 != local_248) {
        operator_delete(local_258,(ulong)((long)local_248[0] + 1));
      }
      if ((long *)CONCAT44(local_208.width,local_208.format) != local_1f8) {
        operator_delete((long *)CONCAT44(local_208.width,local_208.format),local_1f8[0] + 1);
      }
      pTVar7 = local_1b8;
      lVar14 = local_1c0 + 4;
    } while (lVar14 != 0xc);
    if (local_1e8.
        super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1e8.
                      super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1e8.
                            super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1e8.
                            super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((long *)CONCAT44(local_1b0.width,local_1b0.format) != local_1a0) {
      operator_delete((long *)CONCAT44(local_1b0.width,local_1b0.format),local_1a0[0] + 1);
    }
    pFVar9 = (FragmentOutputCase *)
             ((long)&(local_1c8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode + 1);
  } while (pFVar9 != (FragmentOutputCase *)0x9);
  pTVar11 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar11,pTVar6->m_testCtx,"int","Integer output tests");
  tcu::TestNode::addChild(pTVar7,pTVar11);
  lVar14 = 0;
  local_210 = pTVar11;
  do {
    DVar1 = init::requiredIntFormats[lVar14];
    local_38 = lVar14;
    pcVar8 = FboTestUtil::getFormatName(DVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,pcVar8,(allocator<char> *)&local_208);
    local_1e8.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_finish = (BufferSpec *)0x0;
    local_1e8.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (BufferSpec *)0x0;
    iVar16 = 3;
    do {
      local_208.width = 0x40;
      local_208.height = 0x40;
      local_208.samples = 0;
      local_208.format = DVar1;
      if (local_1e8.
          super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_1e8.
          super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
        ::_M_realloc_insert<deqp::gles3::Functional::BufferSpec>
                  (&local_1e8,
                   (iterator)
                   local_1e8.
                   super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_208);
      }
      else {
        (local_1e8.
         super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
         ._M_impl.super__Vector_impl_data._M_finish)->format = DVar1;
        (local_1e8.
         super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
         ._M_impl.super__Vector_impl_data._M_finish)->width = 0x40;
        (local_1e8.
         super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
         ._M_impl.super__Vector_impl_data._M_finish)->height = 0x40;
        (local_1e8.
         super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
         ._M_impl.super__Vector_impl_data._M_finish)->samples = 0;
        local_1e8.
        super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_1e8.
             super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      iVar16 = iVar16 + -1;
    } while (iVar16 != 0);
    lVar14 = 0;
    do {
      PVar2 = *(Precision *)((long)init::precisions + lVar14);
      local_1c0 = lVar14;
      pcVar8 = glu::getPrecisionName(PVar2);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,pcVar8,(allocator<char> *)local_298);
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar3 = (Context *)pTVar6[1]._vptr_TestNode;
      local_258 = local_248;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,CONCAT44(local_1b0.width,local_1b0.format),
                 CONCAT44(local_1b0.samples,local_1b0.height) +
                 CONCAT44(local_1b0.width,local_1b0.format));
      std::__cxx11::string::append((char *)&local_258);
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_258,CONCAT44(local_208.width,local_208.format));
      local_278._0_8_ = local_278 + 0x10;
      pBVar12 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pBVar12) {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        lStack_260 = plVar10[3];
      }
      else {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        local_278._0_8_ = (pointer)*plVar10;
      }
      local_278._8_8_ = plVar10[1];
      *plVar10 = (long)pBVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(local_278);
      local_298._0_8_ = local_298 + 0x10;
      pFVar13 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pFVar13) {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        lStack_280 = plVar10[3];
      }
      else {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        local_298._0_8_ = (pointer)*plVar10;
      }
      uVar4 = local_298._0_8_;
      local_298._8_8_ = plVar10[1];
      *plVar10 = (long)pFVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_238.type = TYPE_INT;
      local_238.location = 0;
      local_238.arrayLength = 3;
      local_238.precision = PVar2;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
      ::_M_realloc_insert<deqp::gles3::Functional::FragmentOutput_const&>
                ((vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
                  *)&local_2b8,(iterator)0x0,&local_238);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector(&local_228,&local_2b8);
      FragmentOutputCase::FragmentOutputCase(pFVar9,pCVar3,(char *)uVar4,"",&local_1e8,&local_228);
      tcu::TestNode::addChild(local_210,(TestNode *)pFVar9);
      if (local_228.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      pTVar6 = local_1d0;
      if (local_2b8.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2b8.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_298._0_8_ != (pointer)(local_298 + 0x10)) {
        operator_delete((void *)local_298._0_8_,(ulong)((long)(DataType *)local_298._16_8_ + 1));
      }
      if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
        operator_delete((void *)local_278._0_8_,(ulong)((long)(deUint32 *)local_278._16_8_ + 1));
      }
      if (local_258 != local_248) {
        operator_delete(local_258,(ulong)((long)local_248[0] + 1));
      }
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar3 = (Context *)pTVar6[1]._vptr_TestNode;
      local_258 = local_248;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,CONCAT44(local_1b0.width,local_1b0.format),
                 CONCAT44(local_1b0.samples,local_1b0.height) +
                 CONCAT44(local_1b0.width,local_1b0.format));
      std::__cxx11::string::append((char *)&local_258);
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_258,CONCAT44(local_208.width,local_208.format));
      local_278._0_8_ = local_278 + 0x10;
      pBVar12 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pBVar12) {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        lStack_260 = plVar10[3];
      }
      else {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        local_278._0_8_ = (pointer)*plVar10;
      }
      local_278._8_8_ = plVar10[1];
      *plVar10 = (long)pBVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(local_278);
      local_298._0_8_ = local_298 + 0x10;
      pFVar13 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pFVar13) {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        lStack_280 = plVar10[3];
      }
      else {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        local_298._0_8_ = (pointer)*plVar10;
      }
      uVar4 = local_298._0_8_;
      local_298._8_8_ = plVar10[1];
      *plVar10 = (long)pFVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_238.type = TYPE_INT_VEC2;
      local_238.location = 0;
      local_238.arrayLength = 3;
      local_238.precision = PVar2;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
      ::_M_realloc_insert<deqp::gles3::Functional::FragmentOutput_const&>
                ((vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
                  *)&local_2b8,(iterator)0x0,&local_238);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector(&local_228,&local_2b8);
      FragmentOutputCase::FragmentOutputCase(pFVar9,pCVar3,(char *)uVar4,"",&local_1e8,&local_228);
      tcu::TestNode::addChild(local_210,(TestNode *)pFVar9);
      if (local_228.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      pTVar6 = local_1d0;
      if (local_2b8.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2b8.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_298._0_8_ != (pointer)(local_298 + 0x10)) {
        operator_delete((void *)local_298._0_8_,(ulong)((long)(DataType *)local_298._16_8_ + 1));
      }
      if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
        operator_delete((void *)local_278._0_8_,(ulong)((long)(deUint32 *)local_278._16_8_ + 1));
      }
      if (local_258 != local_248) {
        operator_delete(local_258,(ulong)((long)local_248[0] + 1));
      }
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar3 = (Context *)pTVar6[1]._vptr_TestNode;
      local_258 = local_248;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,CONCAT44(local_1b0.width,local_1b0.format),
                 CONCAT44(local_1b0.samples,local_1b0.height) +
                 CONCAT44(local_1b0.width,local_1b0.format));
      std::__cxx11::string::append((char *)&local_258);
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_258,CONCAT44(local_208.width,local_208.format));
      local_278._0_8_ = local_278 + 0x10;
      pBVar12 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pBVar12) {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        lStack_260 = plVar10[3];
      }
      else {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        local_278._0_8_ = (pointer)*plVar10;
      }
      local_278._8_8_ = plVar10[1];
      *plVar10 = (long)pBVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(local_278);
      local_298._0_8_ = local_298 + 0x10;
      pFVar13 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pFVar13) {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        lStack_280 = plVar10[3];
      }
      else {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        local_298._0_8_ = (pointer)*plVar10;
      }
      uVar4 = local_298._0_8_;
      local_298._8_8_ = plVar10[1];
      *plVar10 = (long)pFVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_238.type = TYPE_INT_VEC3;
      local_238.location = 0;
      local_238.arrayLength = 3;
      local_238.precision = PVar2;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
      ::_M_realloc_insert<deqp::gles3::Functional::FragmentOutput_const&>
                ((vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
                  *)&local_2b8,(iterator)0x0,&local_238);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector(&local_228,&local_2b8);
      FragmentOutputCase::FragmentOutputCase(pFVar9,pCVar3,(char *)uVar4,"",&local_1e8,&local_228);
      tcu::TestNode::addChild(local_210,(TestNode *)pFVar9);
      if (local_228.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      pTVar6 = local_1d0;
      if (local_2b8.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2b8.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_298._0_8_ != (pointer)(local_298 + 0x10)) {
        operator_delete((void *)local_298._0_8_,(ulong)((long)(DataType *)local_298._16_8_ + 1));
      }
      if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
        operator_delete((void *)local_278._0_8_,(ulong)((long)(deUint32 *)local_278._16_8_ + 1));
      }
      if (local_258 != local_248) {
        operator_delete(local_258,(ulong)((long)local_248[0] + 1));
      }
      local_1c8 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar3 = (Context *)pTVar6[1]._vptr_TestNode;
      local_258 = local_248;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,CONCAT44(local_1b0.width,local_1b0.format),
                 CONCAT44(local_1b0.samples,local_1b0.height) +
                 CONCAT44(local_1b0.width,local_1b0.format));
      std::__cxx11::string::append((char *)&local_258);
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_258,CONCAT44(local_208.width,local_208.format));
      local_278._0_8_ = local_278 + 0x10;
      pBVar12 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pBVar12) {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        lStack_260 = plVar10[3];
      }
      else {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        local_278._0_8_ = (pointer)*plVar10;
      }
      local_278._8_8_ = plVar10[1];
      *plVar10 = (long)pBVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(local_278);
      local_298._0_8_ = local_298 + 0x10;
      pFVar13 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pFVar13) {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        lStack_280 = plVar10[3];
      }
      else {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        local_298._0_8_ = (pointer)*plVar10;
      }
      uVar4 = local_298._0_8_;
      local_298._8_8_ = plVar10[1];
      *plVar10 = (long)pFVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_238.type = TYPE_INT_VEC4;
      local_238.location = 0;
      local_238.arrayLength = 3;
      local_238.precision = PVar2;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
      ::_M_realloc_insert<deqp::gles3::Functional::FragmentOutput_const&>
                ((vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
                  *)&local_2b8,(iterator)0x0,&local_238);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector(&local_228,&local_2b8);
      pFVar9 = local_1c8;
      FragmentOutputCase::FragmentOutputCase
                (local_1c8,pCVar3,(char *)uVar4,"",&local_1e8,&local_228);
      tcu::TestNode::addChild(local_210,(TestNode *)pFVar9);
      if (local_228.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_2b8.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2b8.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_298._0_8_ != (pointer)(local_298 + 0x10)) {
        operator_delete((void *)local_298._0_8_,(ulong)((long)(DataType *)local_298._16_8_ + 1));
      }
      if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
        operator_delete((void *)local_278._0_8_,(ulong)((long)(deUint32 *)local_278._16_8_ + 1));
      }
      if (local_258 != local_248) {
        operator_delete(local_258,(ulong)((long)local_248[0] + 1));
      }
      if ((long *)CONCAT44(local_208.width,local_208.format) != local_1f8) {
        operator_delete((long *)CONCAT44(local_208.width,local_208.format),local_1f8[0] + 1);
      }
      pTVar7 = local_1b8;
      lVar14 = local_1c0 + 4;
    } while (lVar14 != 0xc);
    if (local_1e8.
        super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1e8.
                      super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1e8.
                            super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1e8.
                            super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((long *)CONCAT44(local_1b0.width,local_1b0.format) != local_1a0) {
      operator_delete((long *)CONCAT44(local_1b0.width,local_1b0.format),local_1a0[0] + 1);
    }
    lVar14 = local_38 + 1;
  } while (lVar14 != 9);
  pTVar11 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar11,pTVar6->m_testCtx,"uint","Usigned integer output tests");
  tcu::TestNode::addChild(pTVar7,pTVar11);
  lVar14 = 0;
  local_210 = pTVar11;
  do {
    DVar1 = init::requiredUintFormats[lVar14];
    local_1c8 = (FragmentOutputCase *)lVar14;
    pcVar8 = FboTestUtil::getFormatName(DVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,pcVar8,(allocator<char> *)&local_208);
    local_1e8.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_finish = (BufferSpec *)0x0;
    local_1e8.
    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (BufferSpec *)0x0;
    iVar16 = 3;
    do {
      local_208.width = 0x40;
      local_208.height = 0x40;
      local_208.samples = 0;
      local_208.format = DVar1;
      if (local_1e8.
          super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_1e8.
          super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
        ::_M_realloc_insert<deqp::gles3::Functional::BufferSpec>
                  (&local_1e8,
                   (iterator)
                   local_1e8.
                   super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_208);
      }
      else {
        (local_1e8.
         super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
         ._M_impl.super__Vector_impl_data._M_finish)->format = DVar1;
        (local_1e8.
         super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
         ._M_impl.super__Vector_impl_data._M_finish)->width = 0x40;
        (local_1e8.
         super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
         ._M_impl.super__Vector_impl_data._M_finish)->height = 0x40;
        (local_1e8.
         super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
         ._M_impl.super__Vector_impl_data._M_finish)->samples = 0;
        local_1e8.
        super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_1e8.
             super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      iVar16 = iVar16 + -1;
    } while (iVar16 != 0);
    lVar14 = 0;
    do {
      PVar2 = *(Precision *)((long)init::precisions + lVar14);
      local_1c0 = lVar14;
      pcVar8 = glu::getPrecisionName(PVar2);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,pcVar8,(allocator<char> *)local_298);
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar3 = (Context *)local_1d0[1]._vptr_TestNode;
      local_258 = local_248;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,CONCAT44(local_1b0.width,local_1b0.format),
                 CONCAT44(local_1b0.samples,local_1b0.height) +
                 CONCAT44(local_1b0.width,local_1b0.format));
      std::__cxx11::string::append((char *)&local_258);
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_258,CONCAT44(local_208.width,local_208.format));
      local_278._0_8_ = local_278 + 0x10;
      pBVar12 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pBVar12) {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        lStack_260 = plVar10[3];
      }
      else {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        local_278._0_8_ = (pointer)*plVar10;
      }
      local_278._8_8_ = plVar10[1];
      *plVar10 = (long)pBVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(local_278);
      local_298._0_8_ = local_298 + 0x10;
      pFVar13 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pFVar13) {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        lStack_280 = plVar10[3];
      }
      else {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        local_298._0_8_ = (pointer)*plVar10;
      }
      uVar4 = local_298._0_8_;
      local_298._8_8_ = plVar10[1];
      *plVar10 = (long)pFVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_238.type = TYPE_UINT;
      local_238.location = 0;
      local_238.arrayLength = 3;
      local_238.precision = PVar2;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
      ::_M_realloc_insert<deqp::gles3::Functional::FragmentOutput_const&>
                ((vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
                  *)&local_2b8,(iterator)0x0,&local_238);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector(&local_228,&local_2b8);
      FragmentOutputCase::FragmentOutputCase(pFVar9,pCVar3,(char *)uVar4,"",&local_1e8,&local_228);
      tcu::TestNode::addChild(local_210,(TestNode *)pFVar9);
      if (local_228.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_2b8.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2b8.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_298._0_8_ != (pointer)(local_298 + 0x10)) {
        operator_delete((void *)local_298._0_8_,(ulong)((long)(DataType *)local_298._16_8_ + 1));
      }
      if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
        operator_delete((void *)local_278._0_8_,(ulong)((long)(deUint32 *)local_278._16_8_ + 1));
      }
      if (local_258 != local_248) {
        operator_delete(local_258,(ulong)((long)local_248[0] + 1));
      }
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar3 = (Context *)local_1d0[1]._vptr_TestNode;
      local_258 = local_248;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,CONCAT44(local_1b0.width,local_1b0.format),
                 CONCAT44(local_1b0.samples,local_1b0.height) +
                 CONCAT44(local_1b0.width,local_1b0.format));
      std::__cxx11::string::append((char *)&local_258);
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_258,CONCAT44(local_208.width,local_208.format));
      local_278._0_8_ = local_278 + 0x10;
      pBVar12 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pBVar12) {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        lStack_260 = plVar10[3];
      }
      else {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        local_278._0_8_ = (pointer)*plVar10;
      }
      local_278._8_8_ = plVar10[1];
      *plVar10 = (long)pBVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(local_278);
      local_298._0_8_ = local_298 + 0x10;
      pFVar13 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pFVar13) {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        lStack_280 = plVar10[3];
      }
      else {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        local_298._0_8_ = (pointer)*plVar10;
      }
      uVar4 = local_298._0_8_;
      local_298._8_8_ = plVar10[1];
      *plVar10 = (long)pFVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_238.type = TYPE_UINT_VEC2;
      local_238.location = 0;
      local_238.arrayLength = 3;
      local_238.precision = PVar2;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
      ::_M_realloc_insert<deqp::gles3::Functional::FragmentOutput_const&>
                ((vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
                  *)&local_2b8,(iterator)0x0,&local_238);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector(&local_228,&local_2b8);
      FragmentOutputCase::FragmentOutputCase(pFVar9,pCVar3,(char *)uVar4,"",&local_1e8,&local_228);
      tcu::TestNode::addChild(local_210,(TestNode *)pFVar9);
      if (local_228.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_2b8.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2b8.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_298._0_8_ != (pointer)(local_298 + 0x10)) {
        operator_delete((void *)local_298._0_8_,(ulong)((long)(DataType *)local_298._16_8_ + 1));
      }
      if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
        operator_delete((void *)local_278._0_8_,(ulong)((long)(deUint32 *)local_278._16_8_ + 1));
      }
      if (local_258 != local_248) {
        operator_delete(local_258,(ulong)((long)local_248[0] + 1));
      }
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar3 = (Context *)local_1d0[1]._vptr_TestNode;
      local_258 = local_248;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,CONCAT44(local_1b0.width,local_1b0.format),
                 CONCAT44(local_1b0.samples,local_1b0.height) +
                 CONCAT44(local_1b0.width,local_1b0.format));
      std::__cxx11::string::append((char *)&local_258);
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_258,CONCAT44(local_208.width,local_208.format));
      local_278._0_8_ = local_278 + 0x10;
      pBVar12 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pBVar12) {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        lStack_260 = plVar10[3];
      }
      else {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        local_278._0_8_ = (pointer)*plVar10;
      }
      local_278._8_8_ = plVar10[1];
      *plVar10 = (long)pBVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(local_278);
      local_298._0_8_ = local_298 + 0x10;
      pFVar13 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pFVar13) {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        lStack_280 = plVar10[3];
      }
      else {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        local_298._0_8_ = (pointer)*plVar10;
      }
      uVar4 = local_298._0_8_;
      local_298._8_8_ = plVar10[1];
      *plVar10 = (long)pFVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_238.type = TYPE_UINT_VEC3;
      local_238.location = 0;
      local_238.arrayLength = 3;
      local_238.precision = PVar2;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
      ::_M_realloc_insert<deqp::gles3::Functional::FragmentOutput_const&>
                ((vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
                  *)&local_2b8,(iterator)0x0,&local_238);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector(&local_228,&local_2b8);
      FragmentOutputCase::FragmentOutputCase(pFVar9,pCVar3,(char *)uVar4,"",&local_1e8,&local_228);
      tcu::TestNode::addChild(local_210,(TestNode *)pFVar9);
      if (local_228.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_2b8.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2b8.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_298._0_8_ != (pointer)(local_298 + 0x10)) {
        operator_delete((void *)local_298._0_8_,(ulong)((long)(DataType *)local_298._16_8_ + 1));
      }
      if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
        operator_delete((void *)local_278._0_8_,(ulong)((long)(deUint32 *)local_278._16_8_ + 1));
      }
      if (local_258 != local_248) {
        operator_delete(local_258,(ulong)((long)local_248[0] + 1));
      }
      pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar3 = (Context *)local_1d0[1]._vptr_TestNode;
      local_258 = local_248;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,CONCAT44(local_1b0.width,local_1b0.format),
                 CONCAT44(local_1b0.samples,local_1b0.height) +
                 CONCAT44(local_1b0.width,local_1b0.format));
      std::__cxx11::string::append((char *)&local_258);
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_258,CONCAT44(local_208.width,local_208.format));
      local_278._0_8_ = local_278 + 0x10;
      pBVar12 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pBVar12) {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        lStack_260 = plVar10[3];
      }
      else {
        local_278._16_8_ = *(undefined8 *)pBVar12;
        local_278._0_8_ = (pointer)*plVar10;
      }
      local_278._8_8_ = plVar10[1];
      *plVar10 = (long)pBVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(local_278);
      local_298._0_8_ = local_298 + 0x10;
      pFVar13 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pFVar13) {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        lStack_280 = plVar10[3];
      }
      else {
        local_298._16_8_ = *(undefined8 *)pFVar13;
        local_298._0_8_ = (pointer)*plVar10;
      }
      uVar4 = local_298._0_8_;
      local_298._8_8_ = plVar10[1];
      *plVar10 = (long)pFVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b8.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_238.type = TYPE_UINT_VEC4;
      local_238.location = 0;
      local_238.arrayLength = 3;
      local_238.precision = PVar2;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
      ::_M_realloc_insert<deqp::gles3::Functional::FragmentOutput_const&>
                ((vector<deqp::gles3::Functional::FragmentOutput,std::allocator<deqp::gles3::Functional::FragmentOutput>>
                  *)&local_2b8,(iterator)0x0,&local_238);
      pTVar6 = local_210;
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::vector(&local_228,&local_2b8);
      FragmentOutputCase::FragmentOutputCase(pFVar9,pCVar3,(char *)uVar4,"",&local_1e8,&local_228);
      tcu::TestNode::addChild(pTVar6,(TestNode *)pFVar9);
      if (local_228.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_2b8.
          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2b8.
                        super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_298._0_8_ != (pointer)(local_298 + 0x10)) {
        operator_delete((void *)local_298._0_8_,(ulong)((long)(DataType *)local_298._16_8_ + 1));
      }
      if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
        operator_delete((void *)local_278._0_8_,(ulong)((long)(deUint32 *)local_278._16_8_ + 1));
      }
      if (local_258 != local_248) {
        operator_delete(local_258,(ulong)((long)local_248[0] + 1));
      }
      if ((long *)CONCAT44(local_208.width,local_208.format) != local_1f8) {
        operator_delete((long *)CONCAT44(local_208.width,local_208.format),local_1f8[0] + 1);
      }
      pTVar6 = local_1d0;
      lVar14 = local_1c0 + 4;
    } while (lVar14 != 0xc);
    if (local_1e8.
        super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1e8.
                      super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1e8.
                            super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1e8.
                            super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((long *)CONCAT44(local_1b0.width,local_1b0.format) != local_1a0) {
      operator_delete((long *)CONCAT44(local_1b0.width,local_1b0.format),local_1a0[0] + 1);
    }
    lVar14 = (long)local_1c8 + 1;
  } while (lVar14 != 10);
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,pTVar6->m_testCtx,"random","Random fragment output cases");
  tcu::TestNode::addChild(pTVar6,pTVar7);
  local_1c0 = 0;
  local_1b8 = pTVar7;
  do {
    local_1c8 = (FragmentOutputCase *)pTVar6[1]._vptr_TestNode;
    deRandom_init((deRandom *)&local_1e8,(deUint32)local_1c0);
    local_298._16_8_ = (FragmentOutput *)0x0;
    local_298._0_8_ = (pointer)0x0;
    local_298._8_8_ = (FragmentOutput *)0x0;
    local_278._16_8_ = (BufferSpec *)0x0;
    local_278._0_8_ = (pointer)0x0;
    local_278._8_8_ = (BufferSpec *)0x0;
    local_248[0] = (DataType *)0x0;
    local_258 = (DataType **)0x0;
    iStack_250._M_current = (DataType *)0x0;
    dVar5 = deRandom_getUint32((deRandom *)&local_1e8);
    iVar16 = dVar5 % 3 + 2;
    iVar17 = 0;
    local_210 = (TestNode *)CONCAT44(local_210._4_4_,iVar16);
    do {
      fVar18 = deRandom_getFloat((deRandom *)&local_1e8);
      if (0.3 <= fVar18) {
        iVar16 = 0;
        iVar15 = 1;
      }
      else {
        dVar5 = deRandom_getUint32((deRandom *)&local_1e8);
        iVar15 = dVar5 % (uint)(iVar16 - iVar17) + 1;
        iVar16 = iVar15;
      }
      local_1b0.format = TYPE_INVALID;
      de::Random::choose<glu::DataType_const*,glu::DataType*>
                ((Random *)&local_1e8,
                 (DataType *)
                 createRandomCase(deqp::gles3::Context&,int,int,unsigned_int)::outputTypes,
                 (DataType *)
                 createRandomCase(deqp::gles3::Context&,int,int,unsigned_int)::floatFormats,
                 &local_1b0.format,1);
      local_208.format = local_1b0.format;
      local_1b0.format = 0;
      de::Random::choose<glu::Precision_const*,glu::Precision*>
                ((Random *)&local_1e8,init::precisions,
                 (Precision *)"N4deqp5gles310Functional18FragmentOutputCaseE",&local_1b0.format,1);
      local_1b0.width = local_1b0.format;
      local_1b0.format = local_208.format;
      local_1b0.height = iVar17;
      local_1b0.samples = iVar16;
      if (local_298._8_8_ == local_298._16_8_) {
        std::
        vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
        ::_M_realloc_insert<deqp::gles3::Functional::FragmentOutput>
                  ((vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                    *)local_298,(iterator)local_298._8_8_,(FragmentOutput *)&local_1b0);
      }
      else {
        *(ulong *)local_298._8_8_ = CONCAT44(local_1b0.width,local_208.format);
        *(ulong *)(local_298._8_8_ + 8) = CONCAT44(iVar16,iVar17);
        local_298._8_8_ = local_298._8_8_ + 0x10;
      }
      iVar16 = iVar15;
      if (0 < iVar15) {
        do {
          if (iStack_250._M_current == local_248[0]) {
            std::vector<glu::DataType,std::allocator<glu::DataType>>::
            _M_realloc_insert<glu::DataType_const&>
                      ((vector<glu::DataType,std::allocator<glu::DataType>> *)&local_258,iStack_250,
                       &local_208.format);
          }
          else {
            *iStack_250._M_current = local_208.format;
            iStack_250._M_current = iStack_250._M_current + 1;
          }
          iVar16 = iVar16 + -1;
        } while (iVar16 != 0);
      }
      pTVar6 = local_1d0;
      iVar17 = iVar17 + iVar15;
      iVar16 = (int)local_210;
    } while (iVar17 < (int)local_210);
    lVar14 = (long)(local_278._8_8_ - local_278._0_8_) >> 4;
    iVar17 = (int)lVar14;
    while (iVar17 < iVar16) {
      iVar17 = *(int *)((long)local_258 + lVar14 * 4);
      if (iVar17 - 1U < 4) {
        local_1b0.format = TYPE_INVALID;
        de::Random::choose<unsigned_int_const*,unsigned_int*>
                  ((Random *)&local_1e8,
                   (uint *)createRandomCase(deqp::gles3::Context&,int,int,unsigned_int)::
                           floatFormats,(uint *)&DAT_00b4fe20,&local_1b0.format,1);
      }
      else if (iVar17 - 0x1bU < 4) {
        local_1b0.format = TYPE_INVALID;
        de::Random::choose<unsigned_int_const*,unsigned_int*>
                  ((Random *)&local_1e8,init::requiredIntFormats,(uint *)&DAT_00b4fd04,
                   &local_1b0.format,1);
      }
      else {
        local_1b0.format = TYPE_INVALID;
        if (iVar17 - 0x1fU < 4) {
          local_1b0.format = TYPE_INVALID;
          de::Random::choose<unsigned_int_const*,unsigned_int*>
                    ((Random *)&local_1e8,init::requiredUintFormats,init::precisions,
                     &local_1b0.format,1);
        }
      }
      local_1b0.width = 0x80;
      local_1b0.height = 0x40;
      local_1b0.samples = 0;
      if (local_278._8_8_ == local_278._16_8_) {
        std::
        vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
        ::_M_realloc_insert<deqp::gles3::Functional::BufferSpec>
                  ((vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                    *)local_278,(iterator)local_278._8_8_,&local_1b0);
      }
      else {
        *(ulong *)local_278._8_8_ = CONCAT44(0x80,local_1b0.format);
        *(undefined8 *)(local_278._8_8_ + 8) = 0x40;
        local_278._8_8_ = local_278._8_8_ + 0x10;
      }
      lVar14 = (long)(local_278._8_8_ - local_278._0_8_) >> 4;
      iVar17 = (int)lVar14;
    }
    pFVar9 = (FragmentOutputCase *)operator_new(0xd0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
    pTVar7 = local_1b8;
    std::ostream::_M_insert<unsigned_long>((ulong)&local_1b0);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
    std::ios_base::~ios_base(local_140);
    FragmentOutputCase::FragmentOutputCase
              (pFVar9,(Context *)local_1c8,(char *)CONCAT44(local_208.width,local_208.format),"",
               (vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                *)local_278,
               (vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                *)local_298);
    lVar14 = local_1c0;
    if ((long *)CONCAT44(local_208.width,local_208.format) != local_1f8) {
      operator_delete((long *)CONCAT44(local_208.width,local_208.format),local_1f8[0] + 1);
    }
    if (local_258 != (DataType **)0x0) {
      operator_delete(local_258,(long)local_248[0] - (long)local_258);
    }
    if ((pointer)local_278._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_278._0_8_,local_278._16_8_ - local_278._0_8_);
    }
    if ((pointer)local_298._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_298._0_8_,local_298._16_8_ - local_298._0_8_);
    }
    tcu::TestNode::addChild(pTVar7,(TestNode *)pFVar9);
    local_1c0 = lVar14 + 1;
  } while (local_1c0 != 100);
  return extraout_EAX;
}

Assistant:

void FragmentOutputTests::init (void)
{
	static const deUint32 requiredFloatFormats[] =
	{
		GL_RGBA32F,
		GL_RGBA16F,
		GL_R11F_G11F_B10F,
		GL_RG32F,
		GL_RG16F,
		GL_R32F,
		GL_R16F
	};
	static const deUint32 requiredFixedFormats[] =
	{
		GL_RGBA8,
		GL_SRGB8_ALPHA8,
		GL_RGB10_A2,
		GL_RGBA4,
		GL_RGB5_A1,
		GL_RGB8,
		GL_RGB565,
		GL_RG8,
		GL_R8
	};
	static const deUint32 requiredIntFormats[] =
	{
		GL_RGBA32I,
		GL_RGBA16I,
		GL_RGBA8I,
		GL_RG32I,
		GL_RG16I,
		GL_RG8I,
		GL_R32I,
		GL_R16I,
		GL_R8I
	};
	static const deUint32 requiredUintFormats[] =
	{
		GL_RGBA32UI,
		GL_RGBA16UI,
		GL_RGBA8UI,
		GL_RGB10_A2UI,
		GL_RG32UI,
		GL_RG16UI,
		GL_RG8UI,
		GL_R32UI,
		GL_R16UI,
		GL_R8UI
	};

	static const glu::Precision precisions[] =
	{
		glu::PRECISION_LOWP,
		glu::PRECISION_MEDIUMP,
		glu::PRECISION_HIGHP
	};

	// .basic.
	{
		tcu::TestCaseGroup* basicGroup = new tcu::TestCaseGroup(m_testCtx, "basic", "Basic fragment output tests");
		addChild(basicGroup);

		const int	width	= 64;
		const int	height	= 64;
		const int	samples	= 0;

		// .float
		tcu::TestCaseGroup* floatGroup = new tcu::TestCaseGroup(m_testCtx, "float", "Floating-point output tests");
		basicGroup->addChild(floatGroup);
		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(requiredFloatFormats); fmtNdx++)
		{
			deUint32			format		= requiredFloatFormats[fmtNdx];
			string				fmtName		= getFormatName(format);
			vector<BufferSpec>	fboSpec;

			fboSpec.push_back(BufferSpec(format, width, height, samples));

			for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
			{
				glu::Precision	prec		= precisions[precNdx];
				string			precName	= glu::getPrecisionName(prec);

				floatGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_float").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT,		prec, 0)).toVec()));
				floatGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_vec2").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT_VEC2,	prec, 0)).toVec()));
				floatGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_vec3").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT_VEC3,	prec, 0)).toVec()));
				floatGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_vec4").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT_VEC4,	prec, 0)).toVec()));
			}
		}

		// .fixed
		tcu::TestCaseGroup* fixedGroup = new tcu::TestCaseGroup(m_testCtx, "fixed", "Fixed-point output tests");
		basicGroup->addChild(fixedGroup);
		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(requiredFixedFormats); fmtNdx++)
		{
			deUint32			format		= requiredFixedFormats[fmtNdx];
			string				fmtName		= getFormatName(format);
			vector<BufferSpec>	fboSpec;

			fboSpec.push_back(BufferSpec(format, width, height, samples));

			for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
			{
				glu::Precision	prec		= precisions[precNdx];
				string			precName	= glu::getPrecisionName(prec);

				fixedGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_float").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT,		prec, 0)).toVec()));
				fixedGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_vec2").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT_VEC2,	prec, 0)).toVec()));
				fixedGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_vec3").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT_VEC3,	prec, 0)).toVec()));
				fixedGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_vec4").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT_VEC4,	prec, 0)).toVec()));
			}
		}

		// .int
		tcu::TestCaseGroup* intGroup = new tcu::TestCaseGroup(m_testCtx, "int", "Integer output tests");
		basicGroup->addChild(intGroup);
		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(requiredIntFormats); fmtNdx++)
		{
			deUint32			format		= requiredIntFormats[fmtNdx];
			string				fmtName		= getFormatName(format);
			vector<BufferSpec>	fboSpec;

			fboSpec.push_back(BufferSpec(format, width, height, samples));

			for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
			{
				glu::Precision	prec		= precisions[precNdx];
				string			precName	= glu::getPrecisionName(prec);

				intGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_int").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_INT,		prec, 0)).toVec()));
				intGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_ivec2").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_INT_VEC2,	prec, 0)).toVec()));
				intGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_ivec3").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_INT_VEC3,	prec, 0)).toVec()));
				intGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_ivec4").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_INT_VEC4,	prec, 0)).toVec()));
			}
		}

		// .uint
		tcu::TestCaseGroup* uintGroup = new tcu::TestCaseGroup(m_testCtx, "uint", "Usigned integer output tests");
		basicGroup->addChild(uintGroup);
		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(requiredUintFormats); fmtNdx++)
		{
			deUint32			format		= requiredUintFormats[fmtNdx];
			string				fmtName		= getFormatName(format);
			vector<BufferSpec>	fboSpec;

			fboSpec.push_back(BufferSpec(format, width, height, samples));

			for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
			{
				glu::Precision	prec		= precisions[precNdx];
				string			precName	= glu::getPrecisionName(prec);

				uintGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_uint").c_str(),		"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_UINT,			prec, 0)).toVec()));
				uintGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_uvec2").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_UINT_VEC2,	prec, 0)).toVec()));
				uintGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_uvec3").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_UINT_VEC3,	prec, 0)).toVec()));
				uintGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_uvec4").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_UINT_VEC4,	prec, 0)).toVec()));
			}
		}
	}

	// .array
	{
		tcu::TestCaseGroup* arrayGroup = new tcu::TestCaseGroup(m_testCtx, "array", "Array outputs");
		addChild(arrayGroup);

		const int	width		= 64;
		const int	height		= 64;
		const int	samples		= 0;
		const int	numTargets	= 3;

		// .float
		tcu::TestCaseGroup* floatGroup = new tcu::TestCaseGroup(m_testCtx, "float", "Floating-point output tests");
		arrayGroup->addChild(floatGroup);
		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(requiredFloatFormats); fmtNdx++)
		{
			deUint32			format		= requiredFloatFormats[fmtNdx];
			string				fmtName		= getFormatName(format);
			vector<BufferSpec>	fboSpec;

			for (int ndx = 0; ndx < numTargets; ndx++)
				fboSpec.push_back(BufferSpec(format, width, height, samples));

			for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
			{
				glu::Precision	prec		= precisions[precNdx];
				string			precName	= glu::getPrecisionName(prec);

				floatGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_float").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT,		prec, 0, numTargets)).toVec()));
				floatGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_vec2").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT_VEC2,	prec, 0, numTargets)).toVec()));
				floatGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_vec3").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT_VEC3,	prec, 0, numTargets)).toVec()));
				floatGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_vec4").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT_VEC4,	prec, 0, numTargets)).toVec()));
			}
		}

		// .fixed
		tcu::TestCaseGroup* fixedGroup = new tcu::TestCaseGroup(m_testCtx, "fixed", "Fixed-point output tests");
		arrayGroup->addChild(fixedGroup);
		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(requiredFixedFormats); fmtNdx++)
		{
			deUint32			format		= requiredFixedFormats[fmtNdx];
			string				fmtName		= getFormatName(format);
			vector<BufferSpec>	fboSpec;

			for (int ndx = 0; ndx < numTargets; ndx++)
				fboSpec.push_back(BufferSpec(format, width, height, samples));

			for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
			{
				glu::Precision	prec		= precisions[precNdx];
				string			precName	= glu::getPrecisionName(prec);

				fixedGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_float").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT,		prec, 0, numTargets)).toVec()));
				fixedGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_vec2").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT_VEC2,	prec, 0, numTargets)).toVec()));
				fixedGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_vec3").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT_VEC3,	prec, 0, numTargets)).toVec()));
				fixedGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_vec4").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT_VEC4,	prec, 0, numTargets)).toVec()));
			}
		}

		// .int
		tcu::TestCaseGroup* intGroup = new tcu::TestCaseGroup(m_testCtx, "int", "Integer output tests");
		arrayGroup->addChild(intGroup);
		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(requiredIntFormats); fmtNdx++)
		{
			deUint32			format		= requiredIntFormats[fmtNdx];
			string				fmtName		= getFormatName(format);
			vector<BufferSpec>	fboSpec;

			for (int ndx = 0; ndx < numTargets; ndx++)
				fboSpec.push_back(BufferSpec(format, width, height, samples));

			for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
			{
				glu::Precision	prec		= precisions[precNdx];
				string			precName	= glu::getPrecisionName(prec);

				intGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_int").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_INT,		prec, 0, numTargets)).toVec()));
				intGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_ivec2").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_INT_VEC2,	prec, 0, numTargets)).toVec()));
				intGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_ivec3").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_INT_VEC3,	prec, 0, numTargets)).toVec()));
				intGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_ivec4").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_INT_VEC4,	prec, 0, numTargets)).toVec()));
			}
		}

		// .uint
		tcu::TestCaseGroup* uintGroup = new tcu::TestCaseGroup(m_testCtx, "uint", "Usigned integer output tests");
		arrayGroup->addChild(uintGroup);
		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(requiredUintFormats); fmtNdx++)
		{
			deUint32			format		= requiredUintFormats[fmtNdx];
			string				fmtName		= getFormatName(format);
			vector<BufferSpec>	fboSpec;

			for (int ndx = 0; ndx < numTargets; ndx++)
				fboSpec.push_back(BufferSpec(format, width, height, samples));

			for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
			{
				glu::Precision	prec		= precisions[precNdx];
				string			precName	= glu::getPrecisionName(prec);

				uintGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_uint").c_str(),		"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_UINT,			prec, 0, numTargets)).toVec()));
				uintGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_uvec2").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_UINT_VEC2,	prec, 0, numTargets)).toVec()));
				uintGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_uvec3").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_UINT_VEC3,	prec, 0, numTargets)).toVec()));
				uintGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_uvec4").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_UINT_VEC4,	prec, 0, numTargets)).toVec()));
			}
		}
	}

	// .random
	{
		tcu::TestCaseGroup* randomGroup = new tcu::TestCaseGroup(m_testCtx, "random", "Random fragment output cases");
		addChild(randomGroup);

		for (deUint32 seed = 0; seed < 100; seed++)
			randomGroup->addChild(createRandomCase(m_context, 2, 4, seed));
	}
}